

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_h<embree::sse2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  Primitive PVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Geometry *pGVar25;
  __int_type_conflict _Var26;
  long lVar27;
  long lVar28;
  long lVar29;
  RTCFilterFunctionN p_Var30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined6 uVar83;
  undefined1 auVar84 [12];
  unkbyte9 Var85;
  undefined1 auVar86 [13];
  undefined1 auVar87 [12];
  undefined1 auVar88 [13];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [13];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [13];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [13];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [13];
  undefined1 auVar115 [15];
  vfloat_impl<4> vVar116;
  undefined4 uVar117;
  undefined4 uVar118;
  ulong uVar119;
  long lVar120;
  StackEntry *pSVar121;
  long extraout_RAX;
  long extraout_RAX_00;
  RTCIntersectArguments *pRVar122;
  RTCIntersectArguments *pRVar123;
  RTCIntersectArguments *pRVar124;
  RTCIntersectArguments *extraout_RDX;
  RTCIntersectArguments *extraout_RDX_00;
  RTCIntersectArguments *extraout_RDX_01;
  RTCIntersectArguments *extraout_RDX_02;
  RTCIntersectArguments *extraout_RDX_03;
  RTCIntersectArguments *extraout_RDX_04;
  RTCIntersectArguments *pRVar125;
  RTCIntersectArguments *pRVar126;
  byte bVar127;
  RTCIntersectArguments *pRVar128;
  long lVar129;
  ulong uVar130;
  bool bVar131;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  char cVar137;
  float fVar138;
  char cVar174;
  undefined1 uVar175;
  undefined2 uVar176;
  float fVar179;
  undefined1 auVar139 [12];
  char cVar180;
  undefined1 auVar141 [16];
  float fVar181;
  float fVar182;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar140 [12];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float pp;
  float fVar183;
  float fVar220;
  float fVar221;
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  int iVar222;
  int iVar223;
  float fVar224;
  int iVar244;
  undefined1 auVar227 [16];
  undefined1 auVar231 [16];
  undefined1 auVar235 [16];
  float fVar245;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar246;
  int iVar247;
  int iVar248;
  undefined1 auVar252 [12];
  float fVar286;
  undefined1 auVar254 [16];
  undefined1 auVar258 [16];
  undefined1 auVar262 [16];
  float fVar287;
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [12];
  float fVar303;
  float fVar304;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar301 [16];
  float fVar320;
  float fVar322;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar312 [16];
  float fVar321;
  float fVar323;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar319 [16];
  float fVar324;
  float fVar334;
  float fVar336;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar335;
  float fVar337;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar338;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  float fVar347;
  float fVar356;
  float fVar358;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar357;
  float fVar359;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar354;
  undefined1 auVar355 [16];
  float fVar360;
  float fVar361;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar374;
  float fVar377;
  undefined1 auVar372 [16];
  float fVar375;
  float fVar376;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  undefined1 auVar373 [16];
  float fVar383;
  float fVar391;
  float fVar394;
  vfloat4 a;
  undefined1 auVar386 [16];
  float fVar384;
  float fVar385;
  undefined1 auVar387 [16];
  float fVar392;
  float fVar393;
  float fVar395;
  float fVar396;
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar406;
  float fVar407;
  float fVar411;
  float fVar412;
  float fVar416;
  undefined1 auVar401 [16];
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar417;
  float fVar418;
  float fVar419;
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar404;
  undefined1 auVar405 [16];
  float fVar420;
  float fVar424;
  float fVar425;
  __m128 a_2;
  float fVar426;
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  float fVar427;
  float fVar428;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  float fVar439;
  float fVar444;
  float fVar445;
  __m128 a_1;
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  float local_61c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  short local_578;
  undefined2 uStack_576;
  undefined2 uStack_574;
  undefined2 uStack_572;
  int local_51c;
  RTCFilterFunctionNArguments args;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  vfloatx vu0;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined8 local_3a8;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  Primitive *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar151 [16];
  undefined1 auVar142 [16];
  undefined1 auVar152 [16];
  short sVar177;
  int iVar178;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar225 [12];
  undefined1 auVar226 [12];
  undefined1 auVar232 [16];
  undefined1 auVar236 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar249 [12];
  undefined1 auVar250 [12];
  undefined1 auVar251 [12];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [16];
  undefined1 auVar255 [16];
  undefined1 auVar259 [16];
  undefined1 auVar263 [16];
  undefined1 auVar270 [16];
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar264 [16];
  undefined1 auVar271 [16];
  undefined1 auVar292 [16];
  undefined1 auVar300 [16];
  undefined1 auVar302 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar309 [16];
  undefined1 auVar318 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar331 [16];
  undefined1 auVar388 [16];
  
  PVar18 = prim[1];
  uVar119 = (ulong)(byte)PVar18;
  lVar129 = uVar119 * 0x25;
  uVar117 = *(undefined4 *)(prim + uVar119 * 4 + 6);
  uVar19 = *(undefined4 *)(prim + uVar119 * 5 + 6);
  uVar20 = *(undefined4 *)(prim + uVar119 * 6 + 6);
  uVar118 = *(undefined4 *)(prim + uVar119 * 0xf + 6);
  uVar21 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar22 = *(undefined4 *)(prim + uVar119 * 0x11 + 6);
  uVar23 = *(undefined4 *)(prim + uVar119 * 0x1a + 6);
  uVar24 = *(undefined4 *)(prim + uVar119 * 0x1b + 6);
  pPVar7 = prim + lVar129 + 6;
  fVar411 = *(float *)(pPVar7 + 0xc);
  fVar427 = ((ray->org).field_0.m128[0] - *(float *)pPVar7) * fVar411;
  fVar434 = ((ray->org).field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar411;
  fVar436 = ((ray->org).field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar411;
  fVar397 = fVar411 * (ray->dir).field_0.m128[0];
  fVar406 = fVar411 * (ray->dir).field_0.m128[1];
  fVar411 = fVar411 * (ray->dir).field_0.m128[2];
  uVar175 = (undefined1)((uint)uVar19 >> 0x18);
  uVar176 = CONCAT11(uVar175,uVar175);
  uVar175 = (undefined1)((uint)uVar19 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar176,uVar175),CONCAT14(uVar175,uVar19));
  cVar174 = (char)((uint)uVar19 >> 8);
  uVar83 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),cVar174),cVar174);
  cVar137 = (char)uVar19;
  uVar130 = CONCAT62(uVar83,CONCAT11(cVar137,cVar137));
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar130;
  auVar229._12_2_ = uVar176;
  auVar229._14_2_ = uVar176;
  uVar176 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar130;
  auVar228._10_2_ = uVar176;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar176;
  auVar227._0_8_ = uVar130;
  uVar176 = (undefined2)uVar83;
  auVar84._4_8_ = auVar227._8_8_;
  auVar84._2_2_ = uVar176;
  auVar84._0_2_ = uVar176;
  iVar222 = (int)CONCAT11(cVar137,cVar137) >> 8;
  iVar244 = auVar84._0_4_ >> 0x18;
  auVar225._0_8_ = CONCAT44(iVar244,iVar222);
  auVar225._8_4_ = auVar227._8_4_ >> 0x18;
  auVar230._12_4_ = auVar228._12_4_ >> 0x18;
  auVar230._0_12_ = auVar225;
  fVar334 = (float)iVar244;
  cVar180 = cVar174 >> 7;
  auVar34[0xd] = 0;
  auVar34._0_13_ = auVar230._0_13_;
  auVar34[0xe] = cVar180;
  auVar39[0xc] = cVar180;
  auVar39._0_12_ = auVar225;
  auVar39._13_2_ = auVar34._13_2_;
  auVar44[0xb] = 0;
  auVar44._0_11_ = auVar225._0_11_;
  auVar44._12_3_ = auVar39._12_3_;
  auVar49[10] = cVar180;
  auVar49._0_10_ = auVar225._0_10_;
  auVar49._11_4_ = auVar44._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar225._0_9_;
  auVar54._10_5_ = auVar49._10_5_;
  auVar59[8] = cVar174;
  auVar59._0_8_ = auVar225._0_8_;
  auVar59._9_6_ = auVar54._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar137 >> 7);
  auVar64._6_9_ = Var85;
  auVar64[5] = (char)((uint)uVar20 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar137 >> 7);
  auVar64._0_4_ = iVar222;
  cVar180 = (char)((uint)uVar20 >> 8);
  auVar86._2_11_ = auVar64._4_11_;
  auVar86[1] = cVar180;
  auVar86[0] = (undefined1)((short)cVar137 >> 7);
  cVar174 = (char)uVar20;
  auVar69._2_13_ = auVar86;
  auVar69._0_2_ = CONCAT11(cVar174,cVar137);
  uVar176 = (undefined2)Var85;
  auVar233._0_12_ = auVar69._0_12_;
  auVar233._12_2_ = uVar176;
  auVar233._14_2_ = uVar176;
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._0_10_ = auVar69._0_10_;
  auVar232._10_2_ = auVar64._4_2_;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._0_8_ = auVar69._0_8_;
  auVar231._8_2_ = auVar64._4_2_;
  auVar87._4_8_ = auVar231._8_8_;
  auVar87._2_2_ = auVar86._0_2_;
  auVar87._0_2_ = auVar86._0_2_;
  iVar223 = (int)CONCAT11(cVar174,cVar137) >> 8;
  iVar244 = auVar87._0_4_ >> 0x18;
  auVar226._0_8_ = CONCAT44(iVar244,iVar223);
  auVar226._8_4_ = auVar231._8_4_ >> 0x18;
  auVar234._12_4_ = auVar232._12_4_ >> 0x18;
  auVar234._0_12_ = auVar226;
  fVar356 = (float)iVar244;
  cVar137 = cVar180 >> 7;
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar234._0_13_;
  auVar35[0xe] = cVar137;
  auVar40[0xc] = cVar137;
  auVar40._0_12_ = auVar226;
  auVar40._13_2_ = auVar35._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar226._0_11_;
  auVar45._12_3_ = auVar40._12_3_;
  auVar50[10] = cVar137;
  auVar50._0_10_ = auVar226._0_10_;
  auVar50._11_4_ = auVar45._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar226._0_9_;
  auVar55._10_5_ = auVar50._10_5_;
  auVar60[8] = cVar180;
  auVar60._0_8_ = auVar226._0_8_;
  auVar60._9_6_ = auVar55._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar174 >> 7);
  auVar65._6_9_ = Var85;
  auVar65[5] = (char)((uint)uVar21 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar174 >> 7);
  auVar65._0_4_ = iVar223;
  auVar88._2_11_ = auVar65._4_11_;
  auVar88[1] = (char)((uint)uVar21 >> 8);
  auVar88[0] = (undefined1)((short)cVar174 >> 7);
  sVar177 = CONCAT11((char)uVar21,cVar174);
  auVar70._2_13_ = auVar88;
  auVar70._0_2_ = sVar177;
  uVar176 = (undefined2)Var85;
  auVar237._0_12_ = auVar70._0_12_;
  auVar237._12_2_ = uVar176;
  auVar237._14_2_ = uVar176;
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._0_10_ = auVar70._0_10_;
  auVar236._10_2_ = auVar65._4_2_;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._0_8_ = auVar70._0_8_;
  auVar235._8_2_ = auVar65._4_2_;
  auVar89._4_8_ = auVar235._8_8_;
  auVar89._2_2_ = auVar88._0_2_;
  auVar89._0_2_ = auVar88._0_2_;
  fVar338 = (float)((int)sVar177 >> 8);
  fVar342 = (float)(auVar89._0_4_ >> 0x18);
  fVar344 = (float)(auVar235._8_4_ >> 0x18);
  uVar175 = (undefined1)((uint)uVar22 >> 0x18);
  uVar176 = CONCAT11(uVar175,uVar175);
  uVar175 = (undefined1)((uint)uVar22 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar176,uVar175),CONCAT14(uVar175,uVar22));
  uVar175 = (undefined1)((uint)uVar22 >> 8);
  uVar83 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar175),uVar175);
  sVar177 = CONCAT11((char)uVar22,(char)uVar22);
  uVar130 = CONCAT62(uVar83,sVar177);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar130;
  auVar186._12_2_ = uVar176;
  auVar186._14_2_ = uVar176;
  uVar176 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar130;
  auVar185._10_2_ = uVar176;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar176;
  auVar184._0_8_ = uVar130;
  uVar176 = (undefined2)uVar83;
  auVar90._4_8_ = auVar184._8_8_;
  auVar90._2_2_ = uVar176;
  auVar90._0_2_ = uVar176;
  fVar360 = (float)((int)sVar177 >> 8);
  fVar364 = (float)(auVar90._0_4_ >> 0x18);
  fVar366 = (float)(auVar184._8_4_ >> 0x18);
  uVar19 = *(undefined4 *)(prim + uVar119 * 0x1c + 6);
  fVar246 = fVar411 * fVar360;
  fVar286 = fVar411 * fVar364;
  auVar249._0_8_ = CONCAT44(fVar286,fVar246);
  auVar249._8_4_ = fVar411 * fVar366;
  auVar253._12_4_ = fVar411 * (float)(auVar185._12_4_ >> 0x18);
  auVar253._0_12_ = auVar249;
  fVar224 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar129 + 0x16)) *
            *(float *)(prim + lVar129 + 0x1a);
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar253._0_13_;
  auVar36[0xe] = (char)((uint)fVar286 >> 0x18);
  auVar41[0xc] = (char)((uint)fVar286 >> 0x10);
  auVar41._0_12_ = auVar249;
  auVar41._13_2_ = auVar36._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar249._0_11_;
  auVar46._12_3_ = auVar41._12_3_;
  auVar51[10] = (char)((uint)fVar286 >> 8);
  auVar51._0_10_ = auVar249._0_10_;
  auVar51._11_4_ = auVar46._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar249._0_9_;
  auVar56._10_5_ = auVar51._10_5_;
  auVar61[8] = SUB41(fVar286,0);
  auVar61._0_8_ = auVar249._0_8_;
  auVar61._9_6_ = auVar56._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar117 >> 0x18)),
                   (char)((uint)fVar246 >> 0x18));
  auVar66._6_9_ = Var85;
  auVar66[5] = (char)((uint)uVar117 >> 0x10);
  auVar66[4] = (char)((uint)fVar246 >> 0x10);
  auVar66._0_4_ = fVar246;
  cVar180 = (char)((uint)uVar117 >> 8);
  auVar91._2_11_ = auVar66._4_11_;
  auVar91[1] = cVar180;
  auVar91[0] = (char)((uint)fVar246 >> 8);
  cVar174 = (char)uVar117;
  sVar177 = CONCAT11(cVar174,SUB41(fVar246,0));
  auVar71._2_13_ = auVar91;
  auVar71._0_2_ = sVar177;
  uVar176 = (undefined2)Var85;
  auVar256._0_12_ = auVar71._0_12_;
  auVar256._12_2_ = uVar176;
  auVar256._14_2_ = uVar176;
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._0_10_ = auVar71._0_10_;
  auVar255._10_2_ = auVar66._4_2_;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._0_8_ = auVar71._0_8_;
  auVar254._8_2_ = auVar66._4_2_;
  auVar92._4_8_ = auVar254._8_8_;
  auVar92._2_2_ = auVar91._0_2_;
  auVar92._0_2_ = auVar91._0_2_;
  iVar247 = (int)sVar177 >> 8;
  iVar244 = auVar92._0_4_ >> 0x18;
  auVar250._0_8_ = CONCAT44(iVar244,iVar247);
  auVar250._8_4_ = auVar254._8_4_ >> 0x18;
  auVar257._12_4_ = auVar255._12_4_ >> 0x18;
  auVar257._0_12_ = auVar250;
  fVar320 = (float)iVar244;
  local_5f8[0] = (char)uVar118;
  local_5f8[1] = (char)((uint)uVar118 >> 8);
  local_5f8[2] = (undefined1)((uint)uVar118 >> 0x10);
  local_5f8[3] = (undefined1)((uint)uVar118 >> 0x18);
  cVar137 = cVar180 >> 7;
  auVar107[0xd] = 0;
  auVar107._0_13_ = auVar257._0_13_;
  auVar107[0xe] = cVar137;
  auVar108[0xc] = cVar137;
  auVar108._0_12_ = auVar250;
  auVar108._13_2_ = auVar107._13_2_;
  auVar109[0xb] = 0;
  auVar109._0_11_ = auVar250._0_11_;
  auVar109._12_3_ = auVar108._12_3_;
  auVar110[10] = cVar137;
  auVar110._0_10_ = auVar250._0_10_;
  auVar110._11_4_ = auVar109._11_4_;
  auVar111[9] = 0;
  auVar111._0_9_ = auVar250._0_9_;
  auVar111._10_5_ = auVar110._10_5_;
  auVar112[8] = cVar180;
  auVar112._0_8_ = auVar250._0_8_;
  auVar112._9_6_ = auVar111._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar112._8_7_,local_5f8[3]),(short)cVar174 >> 7);
  auVar113._6_9_ = Var85;
  auVar113[5] = local_5f8[2];
  auVar113[4] = (undefined1)((short)cVar174 >> 7);
  auVar113._0_4_ = iVar247;
  auVar114._2_11_ = auVar113._4_11_;
  auVar114[1] = local_5f8[1];
  auVar114[0] = (undefined1)((short)cVar174 >> 7);
  auVar115._2_13_ = auVar114;
  auVar115._0_2_ = CONCAT11(local_5f8[0],cVar174);
  uVar176 = (undefined2)Var85;
  auVar260._0_12_ = auVar115._0_12_;
  auVar260._12_2_ = uVar176;
  auVar260._14_2_ = uVar176;
  auVar259._12_4_ = auVar260._12_4_;
  auVar259._0_10_ = auVar115._0_10_;
  auVar259._10_2_ = auVar113._4_2_;
  auVar258._10_6_ = auVar259._10_6_;
  auVar258._0_8_ = auVar115._0_8_;
  auVar258._8_2_ = auVar113._4_2_;
  auVar93._4_8_ = auVar258._8_8_;
  auVar93._2_2_ = auVar114._0_2_;
  auVar93._0_2_ = auVar114._0_2_;
  iVar248 = (int)CONCAT11(local_5f8[0],cVar174) >> 8;
  iVar244 = auVar93._0_4_ >> 0x18;
  auVar251._0_8_ = CONCAT44(iVar244,iVar248);
  auVar251._8_4_ = auVar258._8_4_ >> 0x18;
  auVar261._12_4_ = auVar259._12_4_ >> 0x18;
  auVar261._0_12_ = auVar251;
  fVar245 = (float)iVar244;
  cVar137 = local_5f8[1] >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar261._0_13_;
  auVar37[0xe] = cVar137;
  auVar42[0xc] = cVar137;
  auVar42._0_12_ = auVar251;
  auVar42._13_2_ = auVar37._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar251._0_11_;
  auVar47._12_3_ = auVar42._12_3_;
  auVar52[10] = cVar137;
  auVar52._0_10_ = auVar251._0_10_;
  auVar52._11_4_ = auVar47._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar251._0_9_;
  auVar57._10_5_ = auVar52._10_5_;
  auVar62[8] = local_5f8[1];
  auVar62._0_8_ = auVar251._0_8_;
  auVar62._9_6_ = auVar57._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar23 >> 0x18)),(short)local_5f8[0] >> 7);
  auVar67._6_9_ = Var85;
  auVar67[5] = (char)((uint)uVar23 >> 0x10);
  auVar67[4] = (undefined1)((short)local_5f8[0] >> 7);
  auVar67._0_4_ = iVar248;
  auVar94._2_11_ = auVar67._4_11_;
  auVar94[1] = (char)((uint)uVar23 >> 8);
  auVar94[0] = (undefined1)((short)local_5f8[0] >> 7);
  sVar177 = CONCAT11((char)uVar23,local_5f8[0]);
  auVar72._2_13_ = auVar94;
  auVar72._0_2_ = sVar177;
  uVar176 = (undefined2)Var85;
  auVar264._0_12_ = auVar72._0_12_;
  auVar264._12_2_ = uVar176;
  auVar264._14_2_ = uVar176;
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._0_10_ = auVar72._0_10_;
  auVar263._10_2_ = auVar67._4_2_;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._0_8_ = auVar72._0_8_;
  auVar262._8_2_ = auVar67._4_2_;
  auVar95._4_8_ = auVar262._8_8_;
  auVar95._2_2_ = auVar94._0_2_;
  auVar95._0_2_ = auVar94._0_2_;
  fVar369 = (float)((int)sVar177 >> 8);
  fVar374 = (float)(auVar95._0_4_ >> 0x18);
  fVar377 = (float)(auVar262._8_4_ >> 0x18);
  uVar175 = (undefined1)((uint)uVar24 >> 0x18);
  uVar176 = CONCAT11(uVar175,uVar175);
  uVar175 = (undefined1)((uint)uVar24 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar176,uVar175),CONCAT14(uVar175,uVar24));
  cVar174 = (char)((uint)uVar24 >> 8);
  uVar83 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),cVar174),cVar174);
  cVar137 = (char)uVar24;
  uVar130 = CONCAT62(uVar83,CONCAT11(cVar137,cVar137));
  auVar325._8_4_ = 0;
  auVar325._0_8_ = uVar130;
  auVar325._12_2_ = uVar176;
  auVar325._14_2_ = uVar176;
  uVar176 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar307._12_4_ = auVar325._12_4_;
  auVar307._8_2_ = 0;
  auVar307._0_8_ = uVar130;
  auVar307._10_2_ = uVar176;
  auVar350._10_6_ = auVar307._10_6_;
  auVar350._8_2_ = uVar176;
  auVar350._0_8_ = uVar130;
  uVar176 = (undefined2)uVar83;
  auVar96._4_8_ = auVar350._8_8_;
  auVar96._2_2_ = uVar176;
  auVar96._0_2_ = uVar176;
  iVar244 = (int)CONCAT11(cVar137,cVar137) >> 8;
  iVar178 = auVar96._0_4_ >> 0x18;
  auVar139._0_8_ = CONCAT44(iVar178,iVar244);
  auVar139._8_4_ = auVar350._8_4_ >> 0x18;
  auVar389._12_4_ = auVar307._12_4_ >> 0x18;
  auVar389._0_12_ = auVar139;
  fVar287 = (float)iVar178;
  cVar180 = cVar174 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar389._0_13_;
  auVar38[0xe] = cVar180;
  auVar43[0xc] = cVar180;
  auVar43._0_12_ = auVar139;
  auVar43._13_2_ = auVar38._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar139._0_11_;
  auVar48._12_3_ = auVar43._12_3_;
  auVar53[10] = cVar180;
  auVar53._0_10_ = auVar139._0_10_;
  auVar53._11_4_ = auVar48._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar139._0_9_;
  auVar58._10_5_ = auVar53._10_5_;
  auVar63[8] = cVar174;
  auVar63._0_8_ = auVar139._0_8_;
  auVar63._9_6_ = auVar58._9_6_;
  Var85 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar137 >> 7);
  auVar68._6_9_ = Var85;
  auVar68[5] = (char)((uint)uVar19 >> 0x10);
  auVar68[4] = (undefined1)((short)cVar137 >> 7);
  auVar68._0_4_ = iVar244;
  auVar97._2_11_ = auVar68._4_11_;
  auVar97[1] = (char)((uint)uVar19 >> 8);
  auVar97[0] = (undefined1)((short)cVar137 >> 7);
  sVar177 = CONCAT11((char)uVar19,cVar137);
  auVar73._2_13_ = auVar97;
  auVar73._0_2_ = sVar177;
  uVar176 = (undefined2)Var85;
  auVar142._0_12_ = auVar73._0_12_;
  auVar142._12_2_ = uVar176;
  auVar142._14_2_ = uVar176;
  auVar442._12_4_ = auVar142._12_4_;
  auVar442._0_10_ = auVar73._0_10_;
  auVar442._10_2_ = auVar68._4_2_;
  auVar141._10_6_ = auVar442._10_6_;
  auVar141._0_8_ = auVar73._0_8_;
  auVar141._8_2_ = auVar68._4_2_;
  auVar98._4_8_ = auVar141._8_8_;
  auVar98._2_2_ = auVar97._0_2_;
  auVar98._0_2_ = auVar97._0_2_;
  fVar183 = (float)((int)sVar177 >> 8);
  fVar220 = (float)(auVar98._0_4_ >> 0x18);
  fVar221 = (float)(auVar141._8_4_ >> 0x18);
  fVar138 = fVar397 * (float)iVar247 + fVar406 * (float)iVar222 + fVar411 * (float)iVar223;
  fVar179 = fVar397 * fVar320 + fVar406 * fVar334 + fVar411 * fVar356;
  fVar181 = fVar397 * (float)auVar250._8_4_ +
            fVar406 * (float)auVar225._8_4_ + fVar411 * (float)auVar226._8_4_;
  fVar182 = fVar397 * (float)auVar257._12_4_ +
            fVar406 * (float)auVar230._12_4_ + fVar411 * (float)auVar234._12_4_;
  fVar246 = fVar397 * (float)iVar248 + fVar406 * fVar338 + fVar246;
  fVar286 = fVar397 * fVar245 + fVar406 * fVar342 + fVar286;
  fVar303 = fVar397 * (float)auVar251._8_4_ + fVar406 * fVar344 + auVar249._8_4_;
  fVar304 = fVar397 * (float)auVar261._12_4_ +
            fVar406 * (float)(auVar236._12_4_ >> 0x18) + auVar253._12_4_;
  fVar383 = fVar397 * fVar369 + fVar406 * (float)iVar244 + fVar411 * fVar183;
  fVar391 = fVar397 * fVar374 + fVar406 * fVar287 + fVar411 * fVar220;
  fVar394 = fVar397 * fVar377 + fVar406 * (float)auVar139._8_4_ + fVar411 * fVar221;
  fVar397 = fVar397 * (float)(auVar263._12_4_ >> 0x18) +
            fVar406 * (float)auVar389._12_4_ + fVar411 * (float)(auVar442._12_4_ >> 0x18);
  uVar130 = *(ulong *)(prim + uVar119 * 7 + 6);
  uVar9 = *(undefined8 *)(prim + uVar119 * 0xb + 6);
  uVar10 = *(undefined8 *)(prim + uVar119 * 9 + 6);
  local_578 = (short)uVar10;
  uStack_576 = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_574 = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_572 = (undefined2)((ulong)uVar10 >> 0x30);
  uVar11 = *(ulong *)(prim + uVar119 * 0xd + 6);
  fVar406 = (float)iVar247 * fVar427 + (float)iVar222 * fVar434 + (float)iVar223 * fVar436;
  fVar407 = fVar320 * fVar427 + fVar334 * fVar434 + fVar356 * fVar436;
  fVar412 = (float)auVar250._8_4_ * fVar427 +
            (float)auVar225._8_4_ * fVar434 + (float)auVar226._8_4_ * fVar436;
  fVar416 = (float)auVar257._12_4_ * fVar427 +
            (float)auVar230._12_4_ * fVar434 + (float)auVar234._12_4_ * fVar436;
  fVar320 = (float)iVar248 * fVar427 + fVar338 * fVar434 + fVar360 * fVar436;
  fVar334 = fVar245 * fVar427 + fVar342 * fVar434 + fVar364 * fVar436;
  fVar338 = (float)auVar251._8_4_ * fVar427 + fVar344 * fVar434 + fVar366 * fVar436;
  fVar342 = (float)auVar261._12_4_ * fVar427 +
            (float)(auVar236._12_4_ >> 0x18) * fVar434 + (float)(auVar185._12_4_ >> 0x18) * fVar436;
  fVar439 = fVar427 * fVar369 + fVar434 * (float)iVar244 + fVar436 * fVar183;
  fVar444 = fVar427 * fVar374 + fVar434 * fVar287 + fVar436 * fVar220;
  fVar445 = fVar427 * fVar377 + fVar434 * (float)auVar139._8_4_ + fVar436 * fVar221;
  fVar427 = fVar427 * (float)(auVar263._12_4_ >> 0x18) +
            fVar434 * (float)auVar389._12_4_ + fVar436 * (float)(auVar442._12_4_ >> 0x18);
  fVar411 = (float)DAT_01f4bd50;
  fVar183 = DAT_01f4bd50._4_4_;
  fVar220 = DAT_01f4bd50._8_4_;
  fVar221 = DAT_01f4bd50._12_4_;
  uVar132 = -(uint)(fVar411 <= ABS(fVar138));
  uVar133 = -(uint)(fVar183 <= ABS(fVar179));
  uVar134 = -(uint)(fVar220 <= ABS(fVar181));
  uVar135 = -(uint)(fVar221 <= ABS(fVar182));
  auVar143._0_4_ = (uint)fVar138 & uVar132;
  auVar143._4_4_ = (uint)fVar179 & uVar133;
  auVar143._8_4_ = (uint)fVar181 & uVar134;
  auVar143._12_4_ = (uint)fVar182 & uVar135;
  auVar305._0_4_ = ~uVar132 & (uint)fVar411;
  auVar305._4_4_ = ~uVar133 & (uint)fVar183;
  auVar305._8_4_ = ~uVar134 & (uint)fVar220;
  auVar305._12_4_ = ~uVar135 & (uint)fVar221;
  auVar305 = auVar305 | auVar143;
  uVar132 = -(uint)(fVar411 <= ABS(fVar246));
  uVar133 = -(uint)(fVar183 <= ABS(fVar286));
  uVar134 = -(uint)(fVar220 <= ABS(fVar303));
  uVar135 = -(uint)(fVar221 <= ABS(fVar304));
  auVar289._0_4_ = (uint)fVar246 & uVar132;
  auVar289._4_4_ = (uint)fVar286 & uVar133;
  auVar289._8_4_ = (uint)fVar303 & uVar134;
  auVar289._12_4_ = (uint)fVar304 & uVar135;
  auVar144._0_4_ = ~uVar132 & (uint)fVar411;
  auVar144._4_4_ = ~uVar133 & (uint)fVar183;
  auVar144._8_4_ = ~uVar134 & (uint)fVar220;
  auVar144._12_4_ = ~uVar135 & (uint)fVar221;
  auVar144 = auVar144 | auVar289;
  uVar132 = -(uint)(fVar411 <= ABS(fVar383));
  uVar133 = -(uint)(fVar183 <= ABS(fVar391));
  uVar134 = -(uint)(fVar220 <= ABS(fVar394));
  uVar135 = -(uint)(fVar221 <= ABS(fVar397));
  auVar386._0_4_ = (uint)fVar383 & uVar132;
  auVar386._4_4_ = (uint)fVar391 & uVar133;
  auVar386._8_4_ = (uint)fVar394 & uVar134;
  auVar386._12_4_ = (uint)fVar397 & uVar135;
  auVar290._0_4_ = ~uVar132 & (uint)fVar411;
  auVar290._4_4_ = ~uVar133 & (uint)fVar183;
  auVar290._8_4_ = ~uVar134 & (uint)fVar220;
  auVar290._12_4_ = ~uVar135 & (uint)fVar221;
  auVar290 = auVar290 | auVar386;
  auVar325 = rcpps(_DAT_01f4bd50,auVar305);
  fVar364 = auVar325._0_4_;
  auVar306._0_4_ = auVar305._0_4_ * fVar364;
  fVar366 = auVar325._4_4_;
  auVar306._4_4_ = auVar305._4_4_ * fVar366;
  fVar369 = auVar325._8_4_;
  auVar306._8_4_ = auVar305._8_4_ * fVar369;
  fVar374 = auVar325._12_4_;
  auVar306._12_4_ = auVar305._12_4_ * fVar374;
  fVar364 = (1.0 - auVar306._0_4_) * fVar364 + fVar364;
  fVar366 = (1.0 - auVar306._4_4_) * fVar366 + fVar366;
  fVar369 = (1.0 - auVar306._8_4_) * fVar369 + fVar369;
  fVar374 = (1.0 - auVar306._12_4_) * fVar374 + fVar374;
  auVar307 = rcpps(auVar306,auVar144);
  auVar308._0_4_ = auVar307._0_4_;
  auVar145._0_4_ = auVar144._0_4_ * auVar308._0_4_;
  fVar344 = auVar307._4_4_;
  auVar145._4_4_ = auVar144._4_4_ * fVar344;
  fVar356 = auVar307._8_4_;
  auVar145._8_4_ = auVar144._8_4_ * fVar356;
  fVar360 = auVar307._12_4_;
  auVar145._12_4_ = auVar144._12_4_ * fVar360;
  fVar377 = (1.0 - auVar145._0_4_) * auVar308._0_4_ + auVar308._0_4_;
  fVar344 = (1.0 - auVar145._4_4_) * fVar344 + fVar344;
  fVar356 = (1.0 - auVar145._8_4_) * fVar356 + fVar356;
  fVar360 = (1.0 - auVar145._12_4_) * fVar360 + fVar360;
  auVar325 = rcpps(auVar145,auVar290);
  fVar411 = auVar325._0_4_;
  auVar291._0_4_ = auVar290._0_4_ * fVar411;
  fVar138 = auVar325._4_4_;
  fVar179 = auVar290._4_4_ * fVar138;
  auVar288._0_8_ = CONCAT44(fVar179,auVar291._0_4_);
  fVar183 = auVar325._8_4_;
  auVar288._8_4_ = auVar290._8_4_ * fVar183;
  fVar246 = auVar325._12_4_;
  uVar10 = *(undefined8 *)(prim + uVar119 * 0x12 + 6);
  fVar411 = (1.0 - auVar291._0_4_) * fVar411 + fVar411;
  fVar138 = (1.0 - fVar179) * fVar138 + fVar138;
  fVar183 = (1.0 - auVar288._8_4_) * fVar183 + fVar183;
  fVar246 = (1.0 - auVar290._12_4_ * fVar246) * fVar246 + fVar246;
  uVar12 = *(ulong *)(prim + uVar119 * 0x16 + 6);
  uVar176 = (undefined2)(uVar130 >> 0x30);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar130;
  auVar189._12_2_ = uVar176;
  auVar189._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar130 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar130;
  auVar188._10_2_ = uVar176;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar176;
  auVar187._0_8_ = uVar130;
  uVar176 = (undefined2)(uVar130 >> 0x10);
  auVar99._4_8_ = auVar187._8_8_;
  auVar99._2_2_ = uVar176;
  auVar99._0_2_ = uVar176;
  fVar286 = (float)(auVar99._0_4_ >> 0x10);
  fVar287 = (float)(auVar187._8_4_ >> 0x10);
  auVar294._12_2_ = (short)((uint)fVar179 >> 0x10);
  auVar294._0_12_ = auVar288;
  auVar294._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar293._12_4_ = auVar294._12_4_;
  auVar293._0_10_ = auVar288._0_10_;
  auVar293._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar292._10_6_ = auVar293._10_6_;
  auVar292._8_2_ = SUB42(fVar179,0);
  auVar292._0_8_ = auVar288._0_8_;
  auVar291._8_8_ = auVar292._8_8_;
  auVar291._6_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar291._4_2_ = (short)((uint)auVar291._0_4_ >> 0x10);
  uVar13 = *(undefined8 *)(prim + uVar119 * 0x14 + 6);
  auVar311._0_12_ = auVar307._0_12_;
  auVar311._12_2_ = auVar307._6_2_;
  auVar311._14_2_ = uStack_572;
  auVar310._12_4_ = auVar311._12_4_;
  auVar310._0_10_ = auVar307._0_10_;
  auVar310._10_2_ = uStack_574;
  auVar309._10_6_ = auVar310._10_6_;
  auVar309._0_8_ = auVar307._0_8_;
  auVar309._8_2_ = auVar307._4_2_;
  auVar308._8_8_ = auVar309._8_8_;
  auVar308._6_2_ = uStack_576;
  auVar308._4_2_ = auVar307._2_2_;
  fVar383 = (float)(auVar308._4_4_ >> 0x10);
  fVar391 = (float)(auVar309._8_4_ >> 0x10);
  uVar176 = (undefined2)(uVar11 >> 0x30);
  auVar267._8_4_ = 0;
  auVar267._0_8_ = uVar11;
  auVar267._12_2_ = uVar176;
  auVar267._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar11 >> 0x20);
  auVar266._12_4_ = auVar267._12_4_;
  auVar266._8_2_ = 0;
  auVar266._0_8_ = uVar11;
  auVar266._10_2_ = uVar176;
  auVar265._10_6_ = auVar266._10_6_;
  auVar265._8_2_ = uVar176;
  auVar265._0_8_ = uVar11;
  sVar177 = (short)(uVar11 >> 0x10);
  auVar100._4_8_ = auVar265._8_8_;
  auVar100._2_2_ = sVar177;
  auVar100._0_2_ = sVar177;
  auVar268._0_4_ = (int)(short)uVar11;
  iVar178 = auVar100._0_4_ >> 0x10;
  auVar252._0_8_ = CONCAT44(iVar178,auVar268._0_4_);
  auVar252._8_4_ = auVar265._8_4_ >> 0x10;
  auVar271._12_2_ = sVar177 >> 0xf;
  auVar271._0_12_ = auVar252;
  auVar271._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._0_10_ = auVar252._0_10_;
  auVar270._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = sVar177;
  auVar269._0_8_ = auVar252._0_8_;
  auVar268._8_8_ = auVar269._8_8_;
  auVar268._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar268._4_2_ = (short)uVar11 >> 0xf;
  fVar303 = (float)(auVar268._4_4_ >> 0x10);
  fVar304 = (float)(auVar269._8_4_ >> 0x10);
  uVar176 = (undefined2)(uVar12 >> 0x30);
  auVar148._8_4_ = 0;
  auVar148._0_8_ = uVar12;
  auVar148._12_2_ = uVar176;
  auVar148._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar12 >> 0x20);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._8_2_ = 0;
  auVar147._0_8_ = uVar12;
  auVar147._10_2_ = uVar176;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = uVar176;
  auVar146._0_8_ = uVar12;
  sVar177 = (short)(uVar12 >> 0x10);
  auVar101._4_8_ = auVar146._8_8_;
  auVar101._2_2_ = sVar177;
  auVar101._0_2_ = sVar177;
  auVar149._0_4_ = (int)(short)uVar12;
  iVar244 = auVar101._0_4_ >> 0x10;
  auVar140._0_8_ = CONCAT44(iVar244,auVar149._0_4_);
  auVar140._8_4_ = auVar146._8_4_ >> 0x10;
  auVar152._12_2_ = sVar177 >> 0xf;
  auVar152._0_12_ = auVar140;
  auVar152._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar140._0_10_;
  auVar151._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = sVar177;
  auVar150._0_8_ = auVar140._0_8_;
  auVar149._8_8_ = auVar150._8_8_;
  auVar149._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar149._4_2_ = (short)uVar12 >> 0xf;
  fVar179 = (float)(auVar149._4_4_ >> 0x10);
  fVar220 = (float)(auVar150._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar119 * 0x18 + 6);
  uVar176 = (undefined2)(uVar11 >> 0x30);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar11;
  auVar192._12_2_ = uVar176;
  auVar192._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar11 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar11;
  auVar191._10_2_ = uVar176;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar176;
  auVar190._0_8_ = uVar11;
  uVar176 = (undefined2)(uVar11 >> 0x10);
  auVar102._4_8_ = auVar190._8_8_;
  auVar102._2_2_ = uVar176;
  auVar102._0_2_ = uVar176;
  uVar12 = *(ulong *)(prim + uVar119 * 0x1d + 6);
  uVar176 = (undefined2)(uVar12 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar12;
  auVar155._12_2_ = uVar176;
  auVar155._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar12 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar12;
  auVar154._10_2_ = uVar176;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar176;
  auVar153._0_8_ = uVar12;
  uVar176 = (undefined2)(uVar12 >> 0x10);
  auVar103._4_8_ = auVar153._8_8_;
  auVar103._2_2_ = uVar176;
  auVar103._0_2_ = uVar176;
  fVar181 = (float)(auVar103._0_4_ >> 0x10);
  fVar221 = (float)(auVar153._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar119 * 0x21 + 6);
  uVar176 = (undefined2)(uVar14 >> 0x30);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar14;
  auVar195._12_2_ = uVar176;
  auVar195._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar14 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar14;
  auVar194._10_2_ = uVar176;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar176;
  auVar193._0_8_ = uVar14;
  uVar176 = (undefined2)(uVar14 >> 0x10);
  auVar104._4_8_ = auVar193._8_8_;
  auVar104._2_2_ = uVar176;
  auVar104._0_2_ = uVar176;
  uVar15 = *(ulong *)(prim + uVar119 * 0x1f + 6);
  uVar176 = (undefined2)(uVar15 >> 0x30);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar15;
  auVar158._12_2_ = uVar176;
  auVar158._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar15 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar15;
  auVar157._10_2_ = uVar176;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._8_2_ = uVar176;
  auVar156._0_8_ = uVar15;
  uVar176 = (undefined2)(uVar15 >> 0x10);
  auVar105._4_8_ = auVar156._8_8_;
  auVar105._2_2_ = uVar176;
  auVar105._0_2_ = uVar176;
  fVar182 = (float)(auVar105._0_4_ >> 0x10);
  fVar245 = (float)(auVar156._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar119 * 0x23 + 6);
  uVar176 = (undefined2)(uVar16 >> 0x30);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar16;
  auVar198._12_2_ = uVar176;
  auVar198._14_2_ = uVar176;
  uVar176 = (undefined2)(uVar16 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar16;
  auVar197._10_2_ = uVar176;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar176;
  auVar196._0_8_ = uVar16;
  uVar176 = (undefined2)(uVar16 >> 0x10);
  auVar106._4_8_ = auVar196._8_8_;
  auVar106._2_2_ = uVar176;
  auVar106._0_2_ = uVar176;
  auVar295._0_8_ =
       CONCAT44(((((float)(auVar291._4_4_ >> 0x10) - fVar286) * fVar224 + fVar286) - fVar407) *
                fVar366,((((float)(int)(short)uVar9 - (float)(int)(short)uVar130) * fVar224 +
                         (float)(int)(short)uVar130) - fVar406) * fVar364);
  auVar295._8_4_ =
       ((((float)(auVar292._8_4_ >> 0x10) - fVar287) * fVar224 + fVar287) - fVar412) * fVar369;
  auVar295._12_4_ =
       ((((float)(auVar293._12_4_ >> 0x10) - (float)(auVar188._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar188._12_4_ >> 0x10)) - fVar416) * fVar374;
  auVar312._0_4_ =
       ((((float)auVar268._0_4_ - (float)(int)local_578) * fVar224 + (float)(int)local_578) -
       fVar406) * fVar364;
  auVar312._4_4_ = ((((float)iVar178 - fVar383) * fVar224 + fVar383) - fVar407) * fVar366;
  auVar312._8_4_ = ((((float)auVar252._8_4_ - fVar391) * fVar224 + fVar391) - fVar412) * fVar369;
  auVar312._12_4_ =
       ((((float)(auVar266._12_4_ >> 0x10) - (float)(auVar310._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar310._12_4_ >> 0x10)) - fVar416) * fVar374;
  auVar326._0_8_ =
       CONCAT44(((((float)iVar244 - fVar303) * fVar224 + fVar303) - fVar334) * fVar344,
                ((((float)auVar149._0_4_ - (float)(int)(short)uVar10) * fVar224 +
                 (float)(int)(short)uVar10) - fVar320) * fVar377);
  auVar326._8_4_ = ((((float)auVar140._8_4_ - fVar304) * fVar224 + fVar304) - fVar338) * fVar356;
  auVar326._12_4_ =
       ((((float)(auVar147._12_4_ >> 0x10) - (float)(auVar270._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar270._12_4_ >> 0x10)) - fVar342) * fVar360;
  auVar372._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar13) * fVar224 +
        (float)(int)(short)uVar13) - fVar320) * fVar377;
  auVar372._4_4_ =
       ((((float)(auVar102._0_4_ >> 0x10) - fVar179) * fVar224 + fVar179) - fVar334) * fVar344;
  auVar372._8_4_ =
       ((((float)(auVar190._8_4_ >> 0x10) - fVar220) * fVar224 + fVar220) - fVar338) * fVar356;
  auVar372._12_4_ =
       ((((float)(auVar191._12_4_ >> 0x10) - (float)(auVar151._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar151._12_4_ >> 0x10)) - fVar342) * fVar360;
  auVar387._0_8_ =
       CONCAT44(((((float)(auVar104._0_4_ >> 0x10) - fVar181) * fVar224 + fVar181) - fVar444) *
                fVar138,((((float)(int)(short)uVar14 - (float)(int)(short)uVar12) * fVar224 +
                         (float)(int)(short)uVar12) - fVar439) * fVar411);
  auVar387._8_4_ =
       ((((float)(auVar193._8_4_ >> 0x10) - fVar221) * fVar224 + fVar221) - fVar445) * fVar183;
  auVar387._12_4_ =
       ((((float)(auVar194._12_4_ >> 0x10) - (float)(auVar154._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar154._12_4_ >> 0x10)) - fVar427) * fVar246;
  auVar401._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar224 +
        (float)(int)(short)uVar15) - fVar439) * fVar411;
  auVar401._4_4_ =
       ((((float)(auVar106._0_4_ >> 0x10) - fVar182) * fVar224 + fVar182) - fVar444) * fVar138;
  auVar401._8_4_ =
       ((((float)(auVar196._8_4_ >> 0x10) - fVar245) * fVar224 + fVar245) - fVar445) * fVar183;
  auVar401._12_4_ =
       ((((float)(auVar197._12_4_ >> 0x10) - (float)(auVar157._12_4_ >> 0x10)) * fVar224 +
        (float)(auVar157._12_4_ >> 0x10)) - fVar427) * fVar246;
  auVar238._8_4_ = auVar295._8_4_;
  auVar238._0_8_ = auVar295._0_8_;
  auVar238._12_4_ = auVar295._12_4_;
  auVar307 = minps(auVar238,auVar312);
  auVar159._8_4_ = auVar326._8_4_;
  auVar159._0_8_ = auVar326._0_8_;
  auVar159._12_4_ = auVar326._12_4_;
  auVar325 = minps(auVar159,auVar372);
  auVar307 = maxps(auVar307,auVar325);
  auVar160._8_4_ = auVar387._8_4_;
  auVar160._0_8_ = auVar387._0_8_;
  auVar160._12_4_ = auVar387._12_4_;
  auVar325 = minps(auVar160,auVar401);
  uVar118 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar199._4_4_ = uVar118;
  auVar199._0_4_ = uVar118;
  auVar199._8_4_ = uVar118;
  auVar199._12_4_ = uVar118;
  auVar325 = maxps(auVar325,auVar199);
  auVar325 = maxps(auVar307,auVar325);
  fVar138 = auVar325._0_4_ * 0.99999964;
  fVar179 = auVar325._4_4_ * 0.99999964;
  fVar181 = auVar325._8_4_ * 0.99999964;
  fVar182 = auVar325._12_4_ * 0.99999964;
  auVar325 = maxps(auVar295,auVar312);
  auVar307 = maxps(auVar326,auVar372);
  auVar325 = minps(auVar325,auVar307);
  auVar307 = maxps(auVar387,auVar401);
  fVar411 = ray->tfar;
  auVar200._4_4_ = fVar411;
  auVar200._0_4_ = fVar411;
  auVar200._8_4_ = fVar411;
  auVar200._12_4_ = fVar411;
  auVar307 = minps(auVar307,auVar200);
  auVar325 = minps(auVar325,auVar307);
  auVar201._0_4_ = -(uint)(PVar18 != (Primitive)0x0 && fVar138 <= auVar325._0_4_ * 1.0000004);
  auVar201._4_4_ = -(uint)(1 < (byte)PVar18 && fVar179 <= auVar325._4_4_ * 1.0000004);
  auVar201._8_4_ = -(uint)(2 < (byte)PVar18 && fVar181 <= auVar325._8_4_ * 1.0000004);
  auVar201._12_4_ = -(uint)(3 < (byte)PVar18 && fVar182 <= auVar325._12_4_ * 1.0000004);
  uVar132 = movmskps((int)(uVar119 * 0x1f),auVar201);
  auVar202._0_12_ = mm_lookupmask_ps._240_12_;
  auVar202._12_4_ = 0;
  local_300 = prim;
LAB_00398d5d:
  if (uVar132 == 0) {
LAB_0039b368:
    return uVar132 != 0;
  }
  lVar129 = 0;
  if (uVar132 != 0) {
    for (; (uVar132 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
    }
  }
  pRVar128 = (RTCIntersectArguments *)(ulong)*(uint *)(local_300 + 2);
  pGVar25 = (context->scene->geometries).items[(long)pRVar128].ptr;
  uVar130 = (ulong)*(uint *)(*(long *)&pGVar25->field_0x58 +
                            (ulong)*(uint *)(local_300 + lVar129 * 4 + 6) *
                            pGVar25[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar411 = pGVar25->fnumTimeSegments;
  fVar183 = (pGVar25->time_range).lower;
  fVar220 = (((ray->dir).field_0.m128[3] - fVar183) / ((pGVar25->time_range).upper - fVar183)) *
            fVar411;
  fVar183 = floorf(fVar220);
  fVar411 = fVar411 + -1.0;
  if (fVar411 <= fVar183) {
    fVar183 = fVar411;
  }
  fVar411 = 0.0;
  if (0.0 <= fVar183) {
    fVar411 = fVar183;
  }
  _Var26 = pGVar25[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar120 = (long)(int)fVar411 * 0x38;
  lVar27 = *(long *)(_Var26 + 0x10 + lVar120);
  lVar28 = *(long *)(_Var26 + 0x38 + lVar120);
  lVar29 = *(long *)(_Var26 + 0x48 + lVar120);
  pfVar1 = (float *)(lVar28 + lVar29 * uVar130);
  lVar129 = uVar130 + 1;
  pfVar2 = (float *)(lVar28 + lVar29 * lVar129);
  p_Var30 = pGVar25[4].occlusionFilterN;
  pfVar3 = (float *)(*(long *)(_Var26 + lVar120) + lVar27 * uVar130);
  pfVar4 = (float *)(*(long *)(_Var26 + lVar120) + lVar27 * lVar129);
  pRVar123 = *(RTCIntersectArguments **)(p_Var30 + lVar120 + 0x38);
  ppSVar5 = (Scene **)((long)&pRVar123->flags + uVar130 * *(long *)(p_Var30 + lVar120 + 0x48));
  fVar220 = fVar220 - fVar411;
  fVar287 = 1.0 - fVar220;
  pRVar124 = (RTCIntersectArguments *)(*(long *)(p_Var30 + lVar120 + 0x48) * lVar129);
  pfVar6 = (float *)((long)&pRVar124->flags + (long)&pRVar123->flags);
  local_5f8._0_4_ = *pfVar3 * fVar287 + *pfVar1 * fVar220;
  local_5f8._4_4_ = pfVar3[1] * fVar287 + pfVar1[1] * fVar220;
  fStack_5f0 = pfVar3[2] * fVar287 + pfVar1[2] * fVar220;
  fVar320 = pfVar3[3] * fVar287 + pfVar1[3] * fVar220;
  pfVar1 = (float *)(*(long *)(p_Var30 + lVar120) + *(long *)(p_Var30 + lVar120 + 0x10) * uVar130);
  fVar334 = *pfVar4 * fVar287 + *pfVar2 * fVar220;
  fVar338 = pfVar4[1] * fVar287 + pfVar2[1] * fVar220;
  fVar342 = pfVar4[2] * fVar287 + pfVar2[2] * fVar220;
  fVar303 = pfVar4[3] * fVar287 + pfVar2[3] * fVar220;
  pfVar2 = (float *)(*(long *)(p_Var30 + lVar120) + *(long *)(p_Var30 + lVar120 + 0x10) * lVar129);
  local_4b8._0_4_ =
       (*pfVar1 * fVar287 + *(float *)ppSVar5 * fVar220) * 0.33333334 + (float)local_5f8._0_4_;
  local_4b8._4_4_ =
       (pfVar1[1] * fVar287 + *(float *)((long)ppSVar5 + 4) * fVar220) * 0.33333334 +
       (float)local_5f8._4_4_;
  fStack_4b0 = (pfVar1[2] * fVar287 + *(float *)(ppSVar5 + 1) * fVar220) * 0.33333334 + fStack_5f0;
  fVar304 = fVar334 - (fVar287 * *pfVar2 + fVar220 * *pfVar6) * 0.33333334;
  fVar344 = fVar338 - (fVar287 * pfVar2[1] + fVar220 * pfVar6[1]) * 0.33333334;
  fVar356 = fVar342 - (fVar287 * pfVar2[2] + fVar220 * pfVar6[2]) * 0.33333334;
  fVar411 = (ray->org).field_0.m128[0];
  fVar183 = (ray->org).field_0.m128[1];
  fVar221 = (ray->org).field_0.m128[2];
  local_328 = (ray->dir).field_0.m128[0];
  fVar245 = (ray->dir).field_0.m128[1];
  fVar246 = (ray->dir).field_0.m128[2];
  fVar286 = (ray->dir).field_0.m128[3];
  fVar360 = local_328 * local_328;
  fVar364 = fVar245 * fVar245;
  fVar366 = fVar246 * fVar246;
  fVar286 = fVar286 * fVar286;
  fVar224 = fVar360 + fVar364 + fVar366;
  auVar296._0_8_ = CONCAT44(fVar364 + fVar364 + fVar286,fVar224);
  auVar296._8_4_ = fVar366 + fVar364 + fVar366;
  auVar296._12_4_ = fVar286 + fVar364 + fVar286;
  auVar272._8_4_ = auVar296._8_4_;
  auVar272._0_8_ = auVar296._0_8_;
  auVar272._12_4_ = auVar296._12_4_;
  auVar325 = rcpss(auVar272,auVar296);
  fVar286 = (2.0 - fVar224 * auVar325._0_4_) * auVar325._0_4_ *
            (((fStack_5f0 + fStack_4b0 + fVar356 + fVar342) * 0.25 - fVar221) * fVar246 +
            (((float)local_5f8._4_4_ + (float)local_4b8._4_4_ + fVar344 + fVar338) * 0.25 - fVar183)
            * fVar245 +
            (((float)local_5f8._0_4_ + (float)local_4b8._0_4_ + fVar304 + fVar334) * 0.25 - fVar411)
            * local_328);
  local_318 = ZEXT416((uint)fVar286);
  fVar411 = local_328 * fVar286 + fVar411;
  fVar183 = fVar245 * fVar286 + fVar183;
  fVar221 = fVar246 * fVar286 + fVar221;
  local_5f8._0_4_ = (float)local_5f8._0_4_ - fVar411;
  local_5f8._4_4_ = (float)local_5f8._4_4_ - fVar183;
  fStack_5f0 = fStack_5f0 - fVar221;
  fStack_5ec = fVar320 - 0.0;
  fVar304 = fVar304 - fVar411;
  fVar344 = fVar344 - fVar183;
  fVar356 = fVar356 - fVar221;
  fVar224 = (fVar303 - (fVar287 * pfVar2[3] + fVar220 * pfVar6[3]) * 0.33333334) - 0.0;
  local_4b8._0_4_ = (float)local_4b8._0_4_ - fVar411;
  local_4b8._4_4_ = (float)local_4b8._4_4_ - fVar183;
  fStack_4b0 = fStack_4b0 - fVar221;
  fStack_4ac = ((pfVar1[3] * fVar287 + *(float *)((long)ppSVar5 + 0xc) * fVar220) * 0.33333334 +
               fVar320) - 0.0;
  fVar334 = fVar334 - fVar411;
  fVar338 = fVar338 - fVar183;
  fVar342 = fVar342 - fVar221;
  fVar303 = fVar303 - 0.0;
  fVar220 = fVar360 + fVar366 + fVar364;
  fVar221 = fVar360 + fVar366 + fVar364;
  fVar287 = fVar360 + fVar366 + fVar364;
  fVar360 = fVar360 + fVar366 + fVar364;
  local_2e8 = fVar224;
  fStack_2e4 = fVar224;
  fStack_2e0 = fVar224;
  fStack_2dc = fVar224;
  fStack_324 = local_328;
  fStack_320 = local_328;
  fStack_31c = local_328;
  local_2f8 = ABS(fVar220);
  fStack_2f4 = ABS(fVar221);
  fStack_2f0 = ABS(fVar287);
  fStack_2ec = ABS(fVar360);
  bVar127 = 0;
  pSVar121 = (StackEntry *)0x1;
  local_61c = 1.4013e-45;
  fVar411 = 0.0;
  fVar183 = 1.0;
  pRVar125 = (RTCIntersectArguments *)0x0;
  do {
    fVar436 = fVar183 - fVar411;
    fVar364 = fVar436 * 0.0 + fVar411;
    fVar366 = fVar436 * 0.33333334 + fVar411;
    fVar369 = fVar436 * 0.6666667 + fVar411;
    fVar374 = fVar436 * 1.0 + fVar411;
    fVar384 = 1.0 - fVar364;
    fVar392 = 1.0 - fVar366;
    fVar395 = 1.0 - fVar369;
    fVar396 = 1.0 - fVar374;
    fVar320 = (float)local_4b8._0_4_ * fVar384 + fVar304 * fVar364;
    fVar383 = (float)local_4b8._0_4_ * fVar392 + fVar304 * fVar366;
    fVar391 = (float)local_4b8._0_4_ * fVar395 + fVar304 * fVar369;
    fVar394 = (float)local_4b8._0_4_ * fVar396 + fVar304 * fVar374;
    fVar370 = (float)local_4b8._4_4_ * fVar384 + fVar344 * fVar364;
    fVar375 = (float)local_4b8._4_4_ * fVar392 + fVar344 * fVar366;
    fVar378 = (float)local_4b8._4_4_ * fVar395 + fVar344 * fVar369;
    fVar380 = (float)local_4b8._4_4_ * fVar396 + fVar344 * fVar374;
    fVar361 = fStack_4b0 * fVar384 + fVar356 * fVar364;
    fVar365 = fStack_4b0 * fVar392 + fVar356 * fVar366;
    fVar367 = fStack_4b0 * fVar395 + fVar356 * fVar369;
    fVar368 = fStack_4b0 * fVar396 + fVar356 * fVar374;
    fVar439 = fStack_4ac * fVar384 + local_2e8 * fVar364;
    fVar343 = fStack_4ac * fVar392 + fStack_2e4 * fVar366;
    fVar345 = fStack_4ac * fVar395 + fStack_2e0 * fVar369;
    fVar346 = fStack_4ac * fVar396 + fStack_2dc * fVar374;
    fVar397 = ((float)local_5f8._0_4_ * fVar384 + (float)local_4b8._0_4_ * fVar364) * fVar384 +
              fVar364 * fVar320;
    fVar406 = ((float)local_5f8._0_4_ * fVar392 + (float)local_4b8._0_4_ * fVar366) * fVar392 +
              fVar366 * fVar383;
    fVar407 = ((float)local_5f8._0_4_ * fVar395 + (float)local_4b8._0_4_ * fVar369) * fVar395 +
              fVar369 * fVar391;
    fVar412 = ((float)local_5f8._0_4_ * fVar396 + (float)local_4b8._0_4_ * fVar374) * fVar396 +
              fVar374 * fVar394;
    fVar416 = ((float)local_5f8._4_4_ * fVar384 + (float)local_4b8._4_4_ * fVar364) * fVar384 +
              fVar364 * fVar370;
    fVar427 = ((float)local_5f8._4_4_ * fVar392 + (float)local_4b8._4_4_ * fVar366) * fVar392 +
              fVar366 * fVar375;
    fVar434 = ((float)local_5f8._4_4_ * fVar395 + (float)local_4b8._4_4_ * fVar369) * fVar395 +
              fVar369 * fVar378;
    fVar444 = ((float)local_5f8._4_4_ * fVar396 + (float)local_4b8._4_4_ * fVar374) * fVar396 +
              fVar374 * fVar380;
    fVar445 = (fStack_5f0 * fVar384 + fStack_4b0 * fVar364) * fVar384 + fVar364 * fVar361;
    fVar321 = (fStack_5f0 * fVar392 + fStack_4b0 * fVar366) * fVar392 + fVar366 * fVar365;
    fVar322 = (fStack_5f0 * fVar395 + fStack_4b0 * fVar369) * fVar395 + fVar369 * fVar367;
    fVar323 = (fStack_5f0 * fVar396 + fStack_4b0 * fVar374) * fVar396 + fVar374 * fVar368;
    fVar324 = (fStack_5ec * fVar384 + fStack_4ac * fVar364) * fVar384 + fVar364 * fVar439;
    fVar335 = (fStack_5ec * fVar392 + fStack_4ac * fVar366) * fVar392 + fVar366 * fVar343;
    fVar336 = (fStack_5ec * fVar395 + fStack_4ac * fVar369) * fVar395 + fVar369 * fVar345;
    fVar337 = (fStack_5ec * fVar396 + fStack_4ac * fVar374) * fVar396 + fVar374 * fVar346;
    fVar377 = fVar320 * fVar384 + (fVar304 * fVar384 + fVar334 * fVar364) * fVar364;
    fVar383 = fVar383 * fVar392 + (fVar304 * fVar392 + fVar334 * fVar366) * fVar366;
    fVar391 = fVar391 * fVar395 + (fVar304 * fVar395 + fVar334 * fVar369) * fVar369;
    fVar394 = fVar394 * fVar396 + (fVar304 * fVar396 + fVar334 * fVar374) * fVar374;
    fVar371 = fVar370 * fVar384 + (fVar344 * fVar384 + fVar338 * fVar364) * fVar364;
    fVar376 = fVar375 * fVar392 + (fVar344 * fVar392 + fVar338 * fVar366) * fVar366;
    fVar379 = fVar378 * fVar395 + (fVar344 * fVar395 + fVar338 * fVar369) * fVar369;
    fVar381 = fVar380 * fVar396 + (fVar344 * fVar396 + fVar338 * fVar374) * fVar374;
    fVar370 = fVar361 * fVar384 + (fVar356 * fVar384 + fVar342 * fVar364) * fVar364;
    fVar375 = fVar365 * fVar392 + (fVar356 * fVar392 + fVar342 * fVar366) * fVar366;
    fVar378 = fVar367 * fVar395 + (fVar356 * fVar395 + fVar342 * fVar369) * fVar369;
    fVar380 = fVar368 * fVar396 + (fVar356 * fVar396 + fVar342 * fVar374) * fVar374;
    fVar361 = fVar439 * fVar384 + (local_2e8 * fVar384 + fVar303 * fVar364) * fVar364;
    fVar365 = fVar343 * fVar392 + (fStack_2e4 * fVar392 + fVar303 * fVar366) * fVar366;
    fVar367 = fVar345 * fVar395 + (fStack_2e0 * fVar395 + fVar303 * fVar369) * fVar369;
    fVar368 = fVar346 * fVar396 + (fStack_2dc * fVar396 + fVar303 * fVar374) * fVar374;
    fVar420 = fVar384 * fVar397 + fVar364 * fVar377;
    fVar424 = fVar392 * fVar406 + fVar366 * fVar383;
    fVar425 = fVar395 * fVar407 + fVar369 * fVar391;
    fVar426 = fVar396 * fVar412 + fVar374 * fVar394;
    fVar428 = fVar384 * fVar416 + fVar364 * fVar371;
    fVar435 = fVar392 * fVar427 + fVar366 * fVar376;
    fVar437 = fVar395 * fVar434 + fVar369 * fVar379;
    fVar438 = fVar396 * fVar444 + fVar374 * fVar381;
    fVar398 = fVar384 * fVar445 + fVar364 * fVar370;
    fVar408 = fVar392 * fVar321 + fVar366 * fVar375;
    fVar413 = fVar395 * fVar322 + fVar369 * fVar378;
    fVar417 = fVar396 * fVar323 + fVar374 * fVar380;
    fVar320 = fVar436 * 0.11111111;
    fVar385 = fVar384 * fVar324 + fVar364 * fVar361;
    fVar393 = fVar392 * fVar335 + fVar366 * fVar365;
    auVar388._0_8_ = CONCAT44(fVar393,fVar385);
    auVar388._8_4_ = fVar395 * fVar336 + fVar369 * fVar367;
    auVar388._12_4_ = fVar396 * fVar337 + fVar374 * fVar368;
    fVar439 = (fVar377 - fVar397) * 3.0 * fVar320;
    fVar343 = (fVar383 - fVar406) * 3.0 * fVar320;
    fVar345 = (fVar391 - fVar407) * 3.0 * fVar320;
    fVar346 = (fVar394 - fVar412) * 3.0 * fVar320;
    fVar384 = (fVar371 - fVar416) * 3.0 * fVar320;
    fVar392 = (fVar376 - fVar427) * 3.0 * fVar320;
    fVar395 = (fVar379 - fVar434) * 3.0 * fVar320;
    fVar396 = (fVar381 - fVar444) * 3.0 * fVar320;
    auVar362._0_4_ = (fVar370 - fVar445) * 3.0 * fVar320;
    auVar362._4_4_ = (fVar375 - fVar321) * 3.0 * fVar320;
    auVar362._8_4_ = (fVar378 - fVar322) * 3.0 * fVar320;
    auVar362._12_4_ = (fVar380 - fVar323) * 3.0 * fVar320;
    fVar364 = fVar320 * (fVar365 - fVar335) * 3.0;
    fVar366 = fVar320 * (fVar367 - fVar336) * 3.0;
    fVar369 = fVar320 * (fVar368 - fVar337) * 3.0;
    auVar297._4_4_ = auVar388._8_4_;
    auVar297._0_4_ = fVar393;
    local_608._4_4_ = fVar393 + fVar364;
    local_608._0_4_ = fVar385 + fVar320 * (fVar361 - fVar324) * 3.0;
    fStack_600 = auVar388._8_4_ + fVar366;
    fStack_5fc = auVar388._12_4_ + fVar369;
    auVar297._8_4_ = auVar388._12_4_;
    auVar297._12_4_ = 0;
    auVar203._0_8_ = CONCAT44(auVar388._8_4_ - fVar366,fVar393 - fVar364);
    auVar203._8_4_ = auVar388._12_4_ - fVar369;
    auVar203._12_4_ = 0;
    local_338._0_4_ = fVar435 - fVar428;
    local_338._4_4_ = fVar437 - fVar435;
    fStack_330 = fVar438 - fVar437;
    fStack_32c = 0.0 - fVar438;
    fVar380 = fVar408 - fVar398;
    fVar371 = fVar413 - fVar408;
    fVar376 = fVar417 - fVar413;
    fVar379 = 0.0 - fVar417;
    fVar374 = fVar384 * fVar380 - auVar362._0_4_ * (float)local_338._0_4_;
    fVar377 = fVar392 * fVar371 - auVar362._4_4_ * (float)local_338._4_4_;
    fVar383 = fVar395 * fVar376 - auVar362._8_4_ * fStack_330;
    fVar391 = fVar396 * fVar379 - auVar362._12_4_ * fStack_32c;
    local_348._0_4_ = fVar424 - fVar420;
    local_348._4_4_ = fVar425 - fVar424;
    fStack_340 = fVar426 - fVar425;
    fStack_33c = 0.0 - fVar426;
    fVar394 = auVar362._0_4_ * (float)local_348._0_4_ - fVar439 * fVar380;
    fVar397 = auVar362._4_4_ * (float)local_348._4_4_ - fVar343 * fVar371;
    fVar406 = auVar362._8_4_ * fStack_340 - fVar345 * fVar376;
    fVar407 = auVar362._12_4_ * fStack_33c - fVar346 * fVar379;
    fVar412 = fVar439 * (float)local_338._0_4_ - fVar384 * (float)local_348._0_4_;
    fVar416 = fVar343 * (float)local_338._4_4_ - fVar392 * (float)local_348._4_4_;
    fVar427 = fVar345 * fStack_330 - fVar395 * fStack_340;
    fVar434 = fVar346 * fStack_32c - fVar396 * fStack_33c;
    auVar161._0_4_ = fVar380 * fVar380;
    auVar161._4_4_ = fVar371 * fVar371;
    auVar161._8_4_ = fVar376 * fVar376;
    auVar161._12_4_ = fVar379 * fVar379;
    auVar339._0_4_ =
         (float)local_348._0_4_ * (float)local_348._0_4_ +
         (float)local_338._0_4_ * (float)local_338._0_4_ + auVar161._0_4_;
    auVar339._4_4_ =
         (float)local_348._4_4_ * (float)local_348._4_4_ +
         (float)local_338._4_4_ * (float)local_338._4_4_ + auVar161._4_4_;
    auVar339._8_4_ = fStack_340 * fStack_340 + fStack_330 * fStack_330 + auVar161._8_4_;
    auVar339._12_4_ = fStack_33c * fStack_33c + fStack_32c * fStack_32c + auVar161._12_4_;
    auVar325 = rcpps(auVar161,auVar339);
    fVar320 = auVar325._0_4_;
    fVar364 = auVar325._4_4_;
    fVar366 = auVar325._8_4_;
    fVar369 = auVar325._12_4_;
    fVar320 = (1.0 - fVar320 * auVar339._0_4_) * fVar320 + fVar320;
    fVar364 = (1.0 - fVar364 * auVar339._4_4_) * fVar364 + fVar364;
    fVar366 = (1.0 - fVar366 * auVar339._8_4_) * fVar366 + fVar366;
    fVar369 = (1.0 - fVar369 * auVar339._12_4_) * fVar369 + fVar369;
    fVar444 = fVar380 * fVar392 - (float)local_338._0_4_ * auVar362._4_4_;
    fVar445 = fVar371 * fVar395 - (float)local_338._4_4_ * auVar362._8_4_;
    fVar321 = fVar376 * fVar396 - fStack_330 * auVar362._12_4_;
    fVar322 = fVar379 * 0.0 - fStack_32c * 0.0;
    fVar323 = (float)local_348._0_4_ * auVar362._4_4_ - fVar380 * fVar343;
    fVar324 = (float)local_348._4_4_ * auVar362._8_4_ - fVar371 * fVar345;
    fVar335 = fStack_340 * auVar362._12_4_ - fVar376 * fVar346;
    fVar336 = fStack_33c * 0.0 - fVar379 * 0.0;
    fVar337 = (float)local_338._0_4_ * fVar343 - (float)local_348._0_4_ * fVar392;
    fVar361 = (float)local_338._4_4_ * fVar345 - (float)local_348._4_4_ * fVar395;
    fVar365 = fStack_330 * fVar346 - fStack_340 * fVar396;
    fVar367 = fStack_32c * 0.0 - fStack_33c * 0.0;
    auVar313._0_4_ = (fVar374 * fVar374 + fVar394 * fVar394 + fVar412 * fVar412) * fVar320;
    auVar313._4_4_ = (fVar377 * fVar377 + fVar397 * fVar397 + fVar416 * fVar416) * fVar364;
    auVar313._8_4_ = (fVar383 * fVar383 + fVar406 * fVar406 + fVar427 * fVar427) * fVar366;
    auVar313._12_4_ = (fVar391 * fVar391 + fVar407 * fVar407 + fVar434 * fVar434) * fVar369;
    auVar348._0_4_ = (fVar444 * fVar444 + fVar323 * fVar323 + fVar337 * fVar337) * fVar320;
    auVar348._4_4_ = (fVar445 * fVar445 + fVar324 * fVar324 + fVar361 * fVar361) * fVar364;
    auVar348._8_4_ = (fVar321 * fVar321 + fVar335 * fVar335 + fVar365 * fVar365) * fVar366;
    auVar348._12_4_ = (fVar322 * fVar322 + fVar336 * fVar336 + fVar367 * fVar367) * fVar369;
    auVar307 = maxps(auVar313,auVar348);
    auVar327._8_4_ = auVar388._8_4_;
    auVar327._0_8_ = auVar388._0_8_;
    auVar327._12_4_ = auVar388._12_4_;
    auVar325 = maxps(auVar327,_local_608);
    auVar349._8_4_ = auVar203._8_4_;
    auVar349._0_8_ = auVar203._0_8_;
    auVar349._12_4_ = 0;
    auVar350 = maxps(auVar349,auVar297);
    auVar350 = maxps(auVar325,auVar350);
    auVar389 = minps(auVar388,_local_608);
    auVar325 = minps(auVar203,auVar297);
    auVar389 = minps(auVar389,auVar325);
    auVar325 = sqrtps(auVar325,auVar307);
    auVar307 = rsqrtps(auVar362 >> 0x20,auVar339);
    fVar320 = auVar307._0_4_;
    fVar364 = auVar307._4_4_;
    fVar369 = auVar307._8_4_;
    fVar374 = auVar307._12_4_;
    fVar366 = fVar320 * fVar320 * auVar339._0_4_ * -0.5 * fVar320 + fVar320 * 1.5;
    fVar377 = fVar364 * fVar364 * auVar339._4_4_ * -0.5 * fVar364 + fVar364 * 1.5;
    fVar394 = fVar369 * fVar369 * auVar339._8_4_ * -0.5 * fVar369 + fVar369 * 1.5;
    fVar407 = fVar374 * fVar374 * auVar339._12_4_ * -0.5 * fVar374 + fVar374 * 1.5;
    fVar320 = 0.0 - fVar428;
    fVar369 = 0.0 - fVar435;
    fVar383 = 0.0 - fVar437;
    fVar397 = 0.0 - fVar438;
    fVar381 = 0.0 - fVar398;
    fVar385 = 0.0 - fVar408;
    fVar393 = 0.0 - fVar413;
    fVar382 = 0.0 - fVar417;
    fVar444 = 0.0 - fVar420;
    fVar321 = 0.0 - fVar424;
    fVar323 = 0.0 - fVar425;
    fVar335 = 0.0 - fVar426;
    auVar429._0_4_ = local_328 * fVar444 + fVar245 * fVar320 + fVar246 * fVar381;
    auVar429._4_4_ = fStack_324 * fVar321 + fVar245 * fVar369 + fVar246 * fVar385;
    auVar429._8_4_ = fStack_320 * fVar323 + fVar245 * fVar383 + fVar246 * fVar393;
    auVar429._12_4_ = fStack_31c * fVar335 + fVar245 * fVar397 + fVar246 * fVar382;
    fVar368 = local_328 * (float)local_348._0_4_ * fVar366 +
              fVar245 * (float)local_338._0_4_ * fVar366 + fVar246 * fVar380 * fVar366;
    fVar370 = fStack_324 * (float)local_348._4_4_ * fVar377 +
              fVar245 * (float)local_338._4_4_ * fVar377 + fVar246 * fVar371 * fVar377;
    fVar375 = fStack_320 * fStack_340 * fVar394 +
              fVar245 * fStack_330 * fVar394 + fVar246 * fVar376 * fVar394;
    fVar378 = fStack_31c * fStack_33c * fVar407 +
              fVar245 * fStack_32c * fVar407 + fVar246 * fVar379 * fVar407;
    local_358 = (float)local_348._0_4_ * fVar366 * fVar444 +
                (float)local_338._0_4_ * fVar366 * fVar320 + fVar380 * fVar366 * fVar381;
    fStack_354 = (float)local_348._4_4_ * fVar377 * fVar321 +
                 (float)local_338._4_4_ * fVar377 * fVar369 + fVar371 * fVar377 * fVar385;
    fStack_350 = fStack_340 * fVar394 * fVar323 +
                 fStack_330 * fVar394 * fVar383 + fVar376 * fVar394 * fVar393;
    fStack_34c = fStack_33c * fVar407 * fVar335 +
                 fStack_32c * fVar407 * fVar397 + fVar379 * fVar407 * fVar382;
    fVar399 = auVar429._0_4_ - fVar368 * local_358;
    fVar409 = auVar429._4_4_ - fVar370 * fStack_354;
    fVar414 = auVar429._8_4_ - fVar375 * fStack_350;
    fVar418 = auVar429._12_4_ - fVar378 * fStack_34c;
    fVar364 = (fVar444 * fVar444 + fVar320 * fVar320 + fVar381 * fVar381) - local_358 * local_358;
    fVar374 = (fVar321 * fVar321 + fVar369 * fVar369 + fVar385 * fVar385) - fStack_354 * fStack_354;
    fVar391 = (fVar323 * fVar323 + fVar383 * fVar383 + fVar393 * fVar393) - fStack_350 * fStack_350;
    fVar406 = (fVar335 * fVar335 + fVar397 * fVar397 + fVar382 * fVar382) - fStack_34c * fStack_34c;
    fVar412 = (auVar350._0_4_ + auVar325._0_4_) * 1.0000002;
    fVar416 = (auVar350._4_4_ + auVar325._4_4_) * 1.0000002;
    fVar427 = (auVar350._8_4_ + auVar325._8_4_) * 1.0000002;
    fVar434 = (auVar350._12_4_ + auVar325._12_4_) * 1.0000002;
    fVar412 = fVar364 - fVar412 * fVar412;
    fVar416 = fVar374 - fVar416 * fVar416;
    fVar427 = fVar391 - fVar427 * fVar427;
    fVar434 = fVar406 - fVar434 * fVar434;
    fVar337 = fVar220 - fVar368 * fVar368;
    fVar361 = fVar221 - fVar370 * fVar370;
    fVar365 = fVar287 - fVar375 * fVar375;
    fVar367 = fVar360 - fVar378 * fVar378;
    fVar399 = fVar399 + fVar399;
    fVar409 = fVar409 + fVar409;
    fVar414 = fVar414 + fVar414;
    fVar418 = fVar418 + fVar418;
    auVar204._0_4_ = fVar399 * fVar399 - fVar337 * 4.0 * fVar412;
    auVar204._4_4_ = fVar409 * fVar409 - fVar361 * 4.0 * fVar416;
    auVar204._8_4_ = fVar414 * fVar414 - fVar365 * 4.0 * fVar427;
    auVar204._12_4_ = fVar418 * fVar418 - fVar367 * 4.0 * fVar434;
    auVar314._4_4_ = -(uint)(0.0 <= auVar204._4_4_);
    auVar314._0_4_ = -(uint)(0.0 <= auVar204._0_4_);
    auVar314._8_4_ = -(uint)(0.0 <= auVar204._8_4_);
    auVar314._12_4_ = -(uint)(0.0 <= auVar204._12_4_);
    iVar244 = movmskps((int)pSVar121,auVar314);
    auVar440._0_4_ = (uint)(fVar368 * fVar368) & (uint)DAT_01f46710;
    auVar440._4_4_ = (uint)(fVar370 * fVar370) & DAT_01f46710._4_4_;
    auVar440._8_4_ = (uint)(fVar375 * fVar375) & DAT_01f46710._8_4_;
    auVar440._12_4_ = (uint)(fVar378 * fVar378) & DAT_01f46710._12_4_;
    fVar445 = (float)((uint)fVar337 & (uint)DAT_01f46710);
    fVar322 = (float)((uint)fVar361 & DAT_01f46710._4_4_);
    fVar324 = (float)((uint)fVar365 & DAT_01f46710._8_4_);
    fVar336 = (float)((uint)fVar367 & DAT_01f46710._12_4_);
    local_4e8 = (undefined1  [8])(CONCAT44(fVar409,fVar399) ^ 0x8000000080000000);
    if (iVar244 == 0) {
      iVar244 = 0;
      auVar352 = _DAT_01f45a40;
      auVar421 = _DAT_01f45a30;
    }
    else {
      auVar350 = sqrtps(auVar429,auVar204);
      bVar131 = 0.0 <= auVar204._0_4_;
      uVar133 = -(uint)bVar131;
      bVar31 = 0.0 <= auVar204._4_4_;
      uVar134 = -(uint)bVar31;
      bVar32 = 0.0 <= auVar204._8_4_;
      uVar135 = -(uint)bVar32;
      bVar33 = 0.0 <= auVar204._12_4_;
      uVar136 = -(uint)bVar33;
      auVar328._0_4_ = fVar337 + fVar337;
      auVar328._4_4_ = fVar361 + fVar361;
      auVar328._8_4_ = fVar365 + fVar365;
      auVar328._12_4_ = fVar367 + fVar367;
      auVar307 = rcpps(_DAT_01f46710,auVar328);
      fVar400 = auVar307._0_4_;
      fVar410 = auVar307._4_4_;
      fVar415 = auVar307._8_4_;
      fVar419 = auVar307._12_4_;
      fVar400 = (1.0 - auVar328._0_4_ * fVar400) * fVar400 + fVar400;
      fVar410 = (1.0 - auVar328._4_4_ * fVar410) * fVar410 + fVar410;
      fVar415 = (1.0 - auVar328._8_4_ * fVar415) * fVar415 + fVar415;
      fVar419 = (1.0 - auVar328._12_4_ * fVar419) * fVar419 + fVar419;
      fVar347 = (-fVar399 - auVar350._0_4_) * fVar400;
      fVar357 = (-fVar409 - auVar350._4_4_) * fVar410;
      fVar358 = (-fVar414 - auVar350._8_4_) * fVar415;
      fVar359 = (-fVar418 - auVar350._12_4_) * fVar419;
      fVar400 = (auVar350._0_4_ - fVar399) * fVar400;
      fVar410 = (auVar350._4_4_ - fVar409) * fVar410;
      fVar415 = (auVar350._8_4_ - fVar414) * fVar415;
      fVar419 = (auVar350._12_4_ - fVar418) * fVar419;
      local_218 = (fVar368 * fVar347 + local_358) * fVar366;
      fStack_214 = (fVar370 * fVar357 + fStack_354) * fVar377;
      fStack_210 = (fVar375 * fVar358 + fStack_350) * fVar394;
      fStack_20c = (fVar378 * fVar359 + fStack_34c) * fVar407;
      local_208 = (fVar368 * fVar400 + local_358) * fVar366;
      fStack_204 = (fVar370 * fVar410 + fStack_354) * fVar377;
      fStack_200 = (fVar375 * fVar415 + fStack_350) * fVar394;
      fStack_1fc = (fVar378 * fVar419 + fStack_34c) * fVar407;
      auVar351._0_4_ = (uint)fVar347 & uVar133;
      auVar351._4_4_ = (uint)fVar357 & uVar134;
      auVar351._8_4_ = (uint)fVar358 & uVar135;
      auVar351._12_4_ = (uint)fVar359 & uVar136;
      auVar421._0_8_ = CONCAT44(~uVar134,~uVar133) & 0x7f8000007f800000;
      auVar421._8_4_ = ~uVar135 & 0x7f800000;
      auVar421._12_4_ = ~uVar136 & 0x7f800000;
      auVar421 = auVar421 | auVar351;
      auVar430._0_4_ = (uint)fVar400 & uVar133;
      auVar430._4_4_ = (uint)fVar410 & uVar134;
      auVar430._8_4_ = (uint)fVar415 & uVar135;
      auVar430._12_4_ = (uint)fVar419 & uVar136;
      auVar352._0_8_ = CONCAT44(~uVar134,~uVar133) & 0xff800000ff800000;
      auVar352._8_4_ = ~uVar135 & 0xff800000;
      auVar352._12_4_ = ~uVar136 & 0xff800000;
      auVar352 = auVar352 | auVar430;
      auVar79._4_4_ = fStack_2f4;
      auVar79._0_4_ = local_2f8;
      auVar79._8_4_ = fStack_2f0;
      auVar79._12_4_ = fStack_2ec;
      auVar307 = maxps(auVar79,auVar440);
      fVar400 = auVar307._0_4_ * 1.9073486e-06;
      fVar347 = auVar307._4_4_ * 1.9073486e-06;
      fVar410 = auVar307._8_4_ * 1.9073486e-06;
      fVar357 = auVar307._12_4_ * 1.9073486e-06;
      auVar431._0_4_ = -(uint)(fVar445 < fVar400 && bVar131);
      auVar431._4_4_ = -(uint)(fVar322 < fVar347 && bVar31);
      auVar431._8_4_ = -(uint)(fVar324 < fVar410 && bVar32);
      auVar431._12_4_ = -(uint)(fVar336 < fVar357 && bVar33);
      iVar244 = movmskps(iVar244,auVar431);
      if (iVar244 != 0) {
        uVar133 = -(uint)(fVar412 <= 0.0);
        uVar134 = -(uint)(fVar416 <= 0.0);
        uVar135 = -(uint)(fVar427 <= 0.0);
        uVar136 = -(uint)(fVar434 <= 0.0);
        auVar315._0_4_ = (uVar133 & 0xff800000 | ~uVar133 & 0x7f800000) & auVar431._0_4_;
        auVar315._4_4_ = (uVar134 & 0xff800000 | ~uVar134 & 0x7f800000) & auVar431._4_4_;
        auVar315._8_4_ = (uVar135 & 0xff800000 | ~uVar135 & 0x7f800000) & auVar431._8_4_;
        auVar315._12_4_ = (uVar136 & 0xff800000 | ~uVar136 & 0x7f800000) & auVar431._12_4_;
        auVar402._0_4_ = ~auVar431._0_4_ & auVar421._0_4_;
        auVar402._4_4_ = ~auVar431._4_4_ & auVar421._4_4_;
        auVar402._8_4_ = ~auVar431._8_4_ & auVar421._8_4_;
        auVar402._12_4_ = ~auVar431._12_4_ & auVar421._12_4_;
        auVar422._0_4_ = (uVar133 & 0x7f800000 | ~uVar133 & 0xff800000) & auVar431._0_4_;
        auVar422._4_4_ = (uVar134 & 0x7f800000 | ~uVar134 & 0xff800000) & auVar431._4_4_;
        auVar422._8_4_ = (uVar135 & 0x7f800000 | ~uVar135 & 0xff800000) & auVar431._8_4_;
        auVar422._12_4_ = (uVar136 & 0x7f800000 | ~uVar136 & 0xff800000) & auVar431._12_4_;
        auVar432._0_4_ = ~auVar431._0_4_ & auVar352._0_4_;
        auVar432._4_4_ = ~auVar431._4_4_ & auVar352._4_4_;
        auVar432._8_4_ = ~auVar431._8_4_ & auVar352._8_4_;
        auVar432._12_4_ = ~auVar431._12_4_ & auVar352._12_4_;
        auVar314._4_4_ = -(uint)((fVar347 <= fVar322 || fVar416 <= 0.0) && bVar31);
        auVar314._0_4_ = -(uint)((fVar400 <= fVar445 || fVar412 <= 0.0) && bVar131);
        auVar314._8_4_ = -(uint)((fVar410 <= fVar324 || fVar427 <= 0.0) && bVar32);
        auVar314._12_4_ = -(uint)((fVar357 <= fVar336 || fVar434 <= 0.0) && bVar33);
        auVar352 = auVar432 | auVar422;
        auVar421 = auVar402 | auVar315;
      }
    }
    auVar316._0_4_ = (auVar314._0_4_ << 0x1f) >> 0x1f;
    auVar316._4_4_ = (auVar314._4_4_ << 0x1f) >> 0x1f;
    auVar316._8_4_ = (auVar314._8_4_ << 0x1f) >> 0x1f;
    auVar316._12_4_ = (auVar314._12_4_ << 0x1f) >> 0x1f;
    auVar316 = auVar316 & auVar202;
    iVar244 = movmskps(iVar244,auVar316);
    if (iVar244 != 0) {
      auVar441._0_4_ = (ray->org).field_0.m128[3] - (float)local_318._0_4_;
      auVar441._4_4_ = auVar441._0_4_;
      auVar441._8_4_ = auVar441._0_4_;
      auVar441._12_4_ = auVar441._0_4_;
      auVar442 = maxps(auVar441,auVar421);
      auVar403._0_4_ = ray->tfar - (float)local_318._0_4_;
      auVar403._4_4_ = auVar403._0_4_;
      auVar403._8_4_ = auVar403._0_4_;
      auVar403._12_4_ = auVar403._0_4_;
      auVar350 = minps(auVar403,auVar352);
      auVar205._0_4_ = fVar384 * fVar245 + auVar362._0_4_ * fVar246;
      auVar205._4_4_ = fVar392 * fVar245 + auVar362._4_4_ * fVar246;
      auVar205._8_4_ = fVar395 * fVar245 + auVar362._8_4_ * fVar246;
      auVar205._12_4_ = fVar396 * fVar245 + auVar362._12_4_ * fVar246;
      auVar239._0_4_ = fVar439 * local_328 + auVar205._0_4_;
      auVar239._4_4_ = fVar343 * fStack_324 + auVar205._4_4_;
      auVar239._8_4_ = fVar345 * fStack_320 + auVar205._8_4_;
      auVar239._12_4_ = fVar346 * fStack_31c + auVar205._12_4_;
      auVar307 = rcpps(auVar205,auVar239);
      fVar412 = auVar307._0_4_;
      fVar416 = auVar307._4_4_;
      fVar427 = auVar307._8_4_;
      fVar434 = auVar307._12_4_;
      fVar320 = ((1.0 - auVar239._0_4_ * fVar412) * fVar412 + fVar412) *
                -(fVar444 * fVar439 + fVar320 * fVar384 + fVar381 * auVar362._0_4_);
      fVar369 = ((1.0 - auVar239._4_4_ * fVar416) * fVar416 + fVar416) *
                -(fVar321 * fVar343 + fVar369 * fVar392 + fVar385 * auVar362._4_4_);
      fVar383 = ((1.0 - auVar239._8_4_ * fVar427) * fVar427 + fVar427) *
                -(fVar323 * fVar345 + fVar383 * fVar395 + fVar393 * auVar362._8_4_);
      fVar397 = ((1.0 - auVar239._12_4_ * fVar434) * fVar434 + fVar434) *
                -(fVar335 * fVar346 + fVar397 * fVar396 + fVar382 * auVar362._12_4_);
      uVar133 = -(uint)(auVar239._0_4_ < 0.0 || ABS(auVar239._0_4_) < 1e-18);
      uVar134 = -(uint)(auVar239._4_4_ < 0.0 || ABS(auVar239._4_4_) < 1e-18);
      uVar135 = -(uint)(auVar239._8_4_ < 0.0 || ABS(auVar239._8_4_) < 1e-18);
      uVar136 = -(uint)(auVar239._12_4_ < 0.0 || ABS(auVar239._12_4_) < 1e-18);
      auVar273._0_8_ = CONCAT44(uVar134,uVar133) & 0xff800000ff800000;
      auVar273._8_4_ = uVar135 & 0xff800000;
      auVar273._12_4_ = uVar136 & 0xff800000;
      auVar206._0_4_ = ~uVar133 & (uint)fVar320;
      auVar206._4_4_ = ~uVar134 & (uint)fVar369;
      auVar206._8_4_ = ~uVar135 & (uint)fVar383;
      auVar206._12_4_ = ~uVar136 & (uint)fVar397;
      auVar442 = maxps(auVar442,auVar206 | auVar273);
      uVar133 = -(uint)(0.0 < auVar239._0_4_ || ABS(auVar239._0_4_) < 1e-18);
      uVar134 = -(uint)(0.0 < auVar239._4_4_ || ABS(auVar239._4_4_) < 1e-18);
      uVar135 = -(uint)(0.0 < auVar239._8_4_ || ABS(auVar239._8_4_) < 1e-18);
      uVar136 = -(uint)(0.0 < auVar239._12_4_ || ABS(auVar239._12_4_) < 1e-18);
      auVar207._0_8_ = CONCAT44(uVar134,uVar133) & 0x7f8000007f800000;
      auVar207._8_4_ = uVar135 & 0x7f800000;
      auVar207._12_4_ = uVar136 & 0x7f800000;
      auVar240._0_4_ = ~uVar133 & (uint)fVar320;
      auVar240._4_4_ = ~uVar134 & (uint)fVar369;
      auVar240._8_4_ = ~uVar135 & (uint)fVar383;
      auVar240._12_4_ = ~uVar136 & (uint)fVar397;
      auVar350 = minps(auVar350,auVar240 | auVar207);
      auVar274._0_4_ = (0.0 - fVar435) * -fVar392 + (0.0 - fVar408) * -auVar362._4_4_;
      auVar274._4_4_ = (0.0 - fVar437) * -fVar395 + (0.0 - fVar413) * -auVar362._8_4_;
      auVar274._8_4_ = (0.0 - fVar438) * -fVar396 + (0.0 - fVar417) * -auVar362._12_4_;
      auVar274._12_4_ = 0x80000000;
      auVar162._0_4_ = -fVar343 * local_328 + -fVar392 * fVar245 + -auVar362._4_4_ * fVar246;
      auVar162._4_4_ = -fVar345 * fStack_324 + -fVar395 * fVar245 + -auVar362._8_4_ * fVar246;
      auVar162._8_4_ = -fVar346 * fStack_320 + -fVar396 * fVar245 + -auVar362._12_4_ * fVar246;
      auVar162._12_4_ = fStack_31c * -0.0 + fVar245 * -0.0 + fVar246 * -0.0;
      auVar307 = rcpps(auVar274,auVar162);
      fVar320 = auVar307._0_4_;
      fVar369 = auVar307._4_4_;
      fVar383 = auVar307._8_4_;
      fVar397 = auVar307._12_4_;
      fVar320 = (((float)DAT_01f46a60 - auVar162._0_4_ * fVar320) * fVar320 + fVar320) *
                -((0.0 - fVar424) * -fVar343 + auVar274._0_4_);
      fVar369 = ((DAT_01f46a60._4_4_ - auVar162._4_4_ * fVar369) * fVar369 + fVar369) *
                -((0.0 - fVar425) * -fVar345 + auVar274._4_4_);
      fVar383 = ((DAT_01f46a60._8_4_ - auVar162._8_4_ * fVar383) * fVar383 + fVar383) *
                -((0.0 - fVar426) * -fVar346 + auVar274._8_4_);
      fVar397 = ((DAT_01f46a60._12_4_ - auVar162._12_4_ * fVar397) * fVar397 + fVar397) * 0.0;
      uVar133 = -(uint)(auVar162._0_4_ < 0.0 || ABS(auVar162._0_4_) < 1e-18);
      uVar134 = -(uint)(auVar162._4_4_ < 0.0 || ABS(auVar162._4_4_) < 1e-18);
      uVar135 = -(uint)(auVar162._8_4_ < 0.0 || ABS(auVar162._8_4_) < 1e-18);
      uVar136 = -(uint)(auVar162._12_4_ < 0.0 || ABS(auVar162._12_4_) < 1e-18);
      auVar275._0_8_ = CONCAT44(uVar134,uVar133) & 0xff800000ff800000;
      auVar275._8_4_ = uVar135 & 0xff800000;
      auVar275._12_4_ = uVar136 & 0xff800000;
      auVar208._0_4_ = ~uVar133 & (uint)fVar320;
      auVar208._4_4_ = ~uVar134 & (uint)fVar369;
      auVar208._8_4_ = ~uVar135 & (uint)fVar383;
      auVar208._12_4_ = ~uVar136 & (uint)fVar397;
      auVar307 = maxps(auVar442,auVar208 | auVar275);
      uVar133 = -(uint)(0.0 < auVar162._0_4_ || ABS(auVar162._0_4_) < 1e-18);
      uVar134 = -(uint)(0.0 < auVar162._4_4_ || ABS(auVar162._4_4_) < 1e-18);
      uVar135 = -(uint)(0.0 < auVar162._8_4_ || ABS(auVar162._8_4_) < 1e-18);
      uVar136 = -(uint)(0.0 < auVar162._12_4_ || ABS(auVar162._12_4_) < 1e-18);
      auVar209._0_8_ = CONCAT44(uVar134,uVar133) & 0x7f8000007f800000;
      auVar209._8_4_ = uVar135 & 0x7f800000;
      auVar209._12_4_ = uVar136 & 0x7f800000;
      auVar163._0_4_ = ~uVar133 & (uint)fVar320;
      auVar163._4_4_ = ~uVar134 & (uint)fVar369;
      auVar163._8_4_ = ~uVar135 & (uint)fVar383;
      auVar163._12_4_ = ~uVar136 & (uint)fVar397;
      aVar404 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar350,auVar163 | auVar209);
      fVar397 = auVar307._12_4_;
      fVar320 = auVar307._0_4_;
      fVar369 = auVar307._4_4_;
      fVar383 = auVar307._8_4_;
      auVar433._0_4_ = -(uint)(fVar320 <= aVar404.v[0]) & auVar316._0_4_;
      auVar433._4_4_ = -(uint)(fVar369 <= aVar404.v[1]) & auVar316._4_4_;
      auVar433._8_4_ = -(uint)(fVar383 <= aVar404.v[2]) & auVar316._8_4_;
      auVar433._12_4_ = -(uint)(fVar397 <= aVar404.v[3]) & auVar316._12_4_;
      iVar244 = movmskps(iVar244,auVar433);
      if (iVar244 != 0) {
        auVar76._4_4_ = (auVar389._4_4_ - auVar325._4_4_) * 0.99999976;
        auVar76._0_4_ = (auVar389._0_4_ - auVar325._0_4_) * 0.99999976;
        auVar76._8_4_ = (auVar389._8_4_ - auVar325._8_4_) * 0.99999976;
        auVar76._12_4_ = (auVar389._12_4_ - auVar325._12_4_) * 0.99999976;
        auVar350 = maxps(ZEXT816(0),auVar76);
        auVar81._4_4_ = fStack_214;
        auVar81._0_4_ = local_218;
        auVar81._8_4_ = fStack_210;
        auVar81._12_4_ = fStack_20c;
        auVar325 = minps(auVar81,_DAT_01f46a60);
        auVar298._0_12_ = ZEXT812(0);
        auVar298._12_4_ = 0.0;
        auVar389 = maxps(auVar325,auVar298);
        auVar82._4_4_ = fStack_204;
        auVar82._0_4_ = local_208;
        auVar82._8_4_ = fStack_200;
        auVar82._12_4_ = fStack_1fc;
        auVar325 = minps(auVar82,_DAT_01f46a60);
        auVar325 = maxps(auVar325,auVar298);
        local_108._0_4_ = (auVar389._0_4_ + 0.0) * 0.25 * fVar436 + fVar411;
        local_108._4_4_ = (auVar389._4_4_ + 1.0) * 0.25 * fVar436 + fVar411;
        local_108._8_4_ = (auVar389._8_4_ + 2.0) * 0.25 * fVar436 + fVar411;
        local_108._12_4_ = (auVar389._12_4_ + 3.0) * 0.25 * fVar436 + fVar411;
        local_118[0] = (auVar325._0_4_ + 0.0) * 0.25 * fVar436 + fVar411;
        local_118[1] = (auVar325._4_4_ + 1.0) * 0.25 * fVar436 + fVar411;
        local_118[2] = (auVar325._8_4_ + 2.0) * 0.25 * fVar436 + fVar411;
        local_118[3] = (auVar325._12_4_ + 3.0) * 0.25 * fVar436 + fVar411;
        fVar364 = fVar364 - auVar350._0_4_ * auVar350._0_4_;
        fVar374 = fVar374 - auVar350._4_4_ * auVar350._4_4_;
        fVar391 = fVar391 - auVar350._8_4_ * auVar350._8_4_;
        fVar406 = fVar406 - auVar350._12_4_ * auVar350._12_4_;
        auVar241._0_4_ = fVar337 * 4.0 * fVar364;
        auVar241._4_4_ = fVar361 * 4.0 * fVar374;
        auVar241._8_4_ = fVar365 * 4.0 * fVar391;
        auVar241._12_4_ = fVar367 * 4.0 * fVar406;
        auVar210._0_4_ = fVar399 * fVar399 - auVar241._0_4_;
        auVar210._4_4_ = fVar409 * fVar409 - auVar241._4_4_;
        auVar210._8_4_ = fVar414 * fVar414 - auVar241._8_4_;
        auVar210._12_4_ = fVar418 * fVar418 - auVar241._12_4_;
        auVar390._4_4_ = -(uint)(0.0 <= auVar210._4_4_);
        auVar390._0_4_ = -(uint)(0.0 <= auVar210._0_4_);
        auVar390._8_4_ = -(uint)(0.0 <= auVar210._8_4_);
        auVar390._12_4_ = -(uint)(0.0 <= auVar210._12_4_);
        iVar244 = movmskps(iVar244,auVar390);
        if (iVar244 == 0) {
          _local_5b8 = ZEXT816(0);
          fVar366 = 0.0;
          fVar377 = 0.0;
          fVar394 = 0.0;
          fVar407 = 0.0;
          fVar436 = 0.0;
          fVar439 = 0.0;
          fVar444 = 0.0;
          fVar343 = 0.0;
          fVar412 = 0.0;
          fVar416 = 0.0;
          fVar427 = 0.0;
          fVar434 = 0.0;
          _local_4e8 = ZEXT816(0);
          iVar244 = 0;
          auVar340 = _DAT_01f45a40;
          auVar353 = _DAT_01f45a30;
        }
        else {
          auVar350 = sqrtps(local_108,auVar210);
          auVar164._0_4_ = fVar337 + fVar337;
          auVar164._4_4_ = fVar361 + fVar361;
          auVar164._8_4_ = fVar365 + fVar365;
          auVar164._12_4_ = fVar367 + fVar367;
          auVar325 = rcpps(auVar241,auVar164);
          fVar321 = auVar325._0_4_;
          fVar345 = auVar325._4_4_;
          fVar323 = auVar325._8_4_;
          fVar346 = auVar325._12_4_;
          fVar321 = ((float)DAT_01f46a60 - auVar164._0_4_ * fVar321) * fVar321 + fVar321;
          fVar345 = (DAT_01f46a60._4_4_ - auVar164._4_4_ * fVar345) * fVar345 + fVar345;
          fVar323 = (DAT_01f46a60._8_4_ - auVar164._8_4_ * fVar323) * fVar323 + fVar323;
          fVar346 = (DAT_01f46a60._12_4_ - auVar164._12_4_ * fVar346) * fVar346 + fVar346;
          fVar367 = ((float)local_4e8._0_4_ - auVar350._0_4_) * fVar321;
          fVar384 = ((float)local_4e8._4_4_ - auVar350._4_4_) * fVar345;
          fVar381 = (-fVar414 - auVar350._8_4_) * fVar323;
          fVar392 = (-fVar418 - auVar350._12_4_) * fVar346;
          fVar321 = (auVar350._0_4_ - fVar399) * fVar321;
          fVar345 = (auVar350._4_4_ - fVar409) * fVar345;
          fVar323 = (auVar350._8_4_ - fVar414) * fVar323;
          fVar346 = (auVar350._12_4_ - fVar418) * fVar346;
          fVar335 = (fVar368 * fVar367 + local_358) * fVar366;
          fVar337 = (fVar370 * fVar384 + fStack_354) * fVar377;
          fVar361 = (fVar375 * fVar381 + fStack_350) * fVar394;
          fVar365 = (fVar378 * fVar392 + fStack_34c) * fVar407;
          fVar436 = local_328 * fVar367 - ((float)local_348._0_4_ * fVar335 + fVar420);
          fVar439 = fStack_324 * fVar384 - ((float)local_348._4_4_ * fVar337 + fVar424);
          fVar444 = fStack_320 * fVar381 - (fStack_340 * fVar361 + fVar425);
          fVar343 = fStack_31c * fVar392 - (fStack_33c * fVar365 + fVar426);
          fVar412 = fVar245 * fVar367 - ((float)local_338._0_4_ * fVar335 + fVar428);
          fVar416 = fVar245 * fVar384 - ((float)local_338._4_4_ * fVar337 + fVar435);
          fVar427 = fVar245 * fVar381 - (fStack_330 * fVar361 + fVar437);
          fVar434 = fVar245 * fVar392 - (fStack_32c * fVar365 + fVar438);
          local_4e8._4_4_ = fVar246 * fVar384 - (fVar337 * fVar371 + fVar408);
          local_4e8._0_4_ = fVar246 * fVar367 - (fVar335 * fVar380 + fVar398);
          fStack_4e0 = fVar246 * fVar381 - (fVar361 * fVar376 + fVar413);
          fStack_4dc = fVar246 * fVar392 - (fVar365 * fVar379 + fVar417);
          fVar366 = (fVar368 * fVar321 + local_358) * fVar366;
          fVar377 = (fVar370 * fVar345 + fStack_354) * fVar377;
          fVar394 = (fVar375 * fVar323 + fStack_350) * fVar394;
          fVar407 = (fVar378 * fVar346 + fStack_34c) * fVar407;
          local_5b8._0_4_ = local_328 * fVar321 - ((float)local_348._0_4_ * fVar366 + fVar420);
          local_5b8._4_4_ = fStack_324 * fVar345 - ((float)local_348._4_4_ * fVar377 + fVar424);
          fStack_5b0 = fStack_320 * fVar323 - (fStack_340 * fVar394 + fVar425);
          fStack_5ac = fStack_31c * fVar346 - (fStack_33c * fVar407 + fVar426);
          auVar298._0_4_ = fVar245 * fVar321 - ((float)local_338._0_4_ * fVar366 + fVar428);
          auVar298._4_4_ = fVar245 * fVar345 - ((float)local_338._4_4_ * fVar377 + fVar435);
          auVar298._8_4_ = fVar245 * fVar323 - (fStack_330 * fVar394 + fVar437);
          auVar298._12_4_ = fVar245 * fVar346 - (fStack_32c * fVar407 + fVar438);
          bVar131 = 0.0 <= auVar210._0_4_;
          uVar133 = -(uint)bVar131;
          bVar31 = 0.0 <= auVar210._4_4_;
          uVar134 = -(uint)bVar31;
          bVar32 = 0.0 <= auVar210._8_4_;
          uVar135 = -(uint)bVar32;
          bVar33 = 0.0 <= auVar210._12_4_;
          uVar136 = -(uint)bVar33;
          fVar366 = fVar246 * fVar321 - (fVar366 * fVar380 + fVar398);
          fVar377 = fVar246 * fVar345 - (fVar377 * fVar371 + fVar408);
          fVar394 = fVar246 * fVar323 - (fVar394 * fVar376 + fVar413);
          fVar407 = fVar246 * fVar346 - (fVar407 * fVar379 + fVar417);
          auVar405._0_4_ = (uint)fVar367 & uVar133;
          auVar405._4_4_ = (uint)fVar384 & uVar134;
          auVar405._8_4_ = (uint)fVar381 & uVar135;
          auVar405._12_4_ = (uint)fVar392 & uVar136;
          auVar353._0_8_ = CONCAT44(~uVar134,~uVar133) & 0x7f8000007f800000;
          auVar353._8_4_ = ~uVar135 & 0x7f800000;
          auVar353._12_4_ = ~uVar136 & 0x7f800000;
          auVar353 = auVar353 | auVar405;
          auVar329._0_4_ = (uint)fVar321 & uVar133;
          auVar329._4_4_ = (uint)fVar345 & uVar134;
          auVar329._8_4_ = (uint)fVar323 & uVar135;
          auVar329._12_4_ = (uint)fVar346 & uVar136;
          auVar340._0_8_ = CONCAT44(~uVar134,~uVar133) & 0xff800000ff800000;
          auVar340._8_4_ = ~uVar135 & 0xff800000;
          auVar340._12_4_ = ~uVar136 & 0xff800000;
          auVar340 = auVar340 | auVar329;
          auVar80._4_4_ = fStack_2f4;
          auVar80._0_4_ = local_2f8;
          auVar80._8_4_ = fStack_2f0;
          auVar80._12_4_ = fStack_2ec;
          auVar325 = maxps(auVar80,auVar440);
          fVar321 = auVar325._0_4_ * 1.9073486e-06;
          fVar345 = auVar325._4_4_ * 1.9073486e-06;
          fVar323 = auVar325._8_4_ * 1.9073486e-06;
          fVar346 = auVar325._12_4_ * 1.9073486e-06;
          auVar330._0_4_ = -(uint)(fVar445 < fVar321 && bVar131);
          auVar330._4_4_ = -(uint)(fVar322 < fVar345 && bVar31);
          auVar330._8_4_ = -(uint)(fVar324 < fVar323 && bVar32);
          auVar330._12_4_ = -(uint)(fVar336 < fVar346 && bVar33);
          iVar244 = movmskps(iVar244,auVar330);
          if (iVar244 != 0) {
            uVar133 = -(uint)(fVar364 <= 0.0);
            uVar134 = -(uint)(fVar374 <= 0.0);
            uVar135 = -(uint)(fVar391 <= 0.0);
            uVar136 = -(uint)(fVar406 <= 0.0);
            auVar363._0_4_ = (uVar133 & 0xff800000 | ~uVar133 & 0x7f800000) & auVar330._0_4_;
            auVar363._4_4_ = (uVar134 & 0xff800000 | ~uVar134 & 0x7f800000) & auVar330._4_4_;
            auVar363._8_4_ = (uVar135 & 0xff800000 | ~uVar135 & 0x7f800000) & auVar330._8_4_;
            auVar363._12_4_ = (uVar136 & 0xff800000 | ~uVar136 & 0x7f800000) & auVar330._12_4_;
            auVar373._0_4_ = ~auVar330._0_4_ & auVar353._0_4_;
            auVar373._4_4_ = ~auVar330._4_4_ & auVar353._4_4_;
            auVar373._8_4_ = ~auVar330._8_4_ & auVar353._8_4_;
            auVar373._12_4_ = ~auVar330._12_4_ & auVar353._12_4_;
            auVar353 = auVar373 | auVar363;
            auVar355._0_4_ = (uVar133 & 0x7f800000 | ~uVar133 & 0xff800000) & auVar330._0_4_;
            auVar355._4_4_ = (uVar134 & 0x7f800000 | ~uVar134 & 0xff800000) & auVar330._4_4_;
            auVar355._8_4_ = (uVar135 & 0x7f800000 | ~uVar135 & 0xff800000) & auVar330._8_4_;
            auVar355._12_4_ = (uVar136 & 0x7f800000 | ~uVar136 & 0xff800000) & auVar330._12_4_;
            auVar333._0_4_ = ~auVar330._0_4_ & auVar340._0_4_;
            auVar333._4_4_ = ~auVar330._4_4_ & auVar340._4_4_;
            auVar333._8_4_ = ~auVar330._8_4_ & auVar340._8_4_;
            auVar333._12_4_ = ~auVar330._12_4_ & auVar340._12_4_;
            auVar340 = auVar333 | auVar355;
            auVar390._4_4_ = -(uint)((fVar345 <= fVar322 || fVar374 <= 0.0) && bVar31);
            auVar390._0_4_ = -(uint)((fVar321 <= fVar445 || fVar364 <= 0.0) && bVar131);
            auVar390._8_4_ = -(uint)((fVar323 <= fVar324 || fVar391 <= 0.0) && bVar32);
            auVar390._12_4_ = -(uint)((fVar346 <= fVar336 || fVar406 <= 0.0) && bVar33);
          }
        }
        fVar364 = (ray->dir).field_0.m128[0];
        fVar374 = (ray->dir).field_0.m128[1];
        fVar391 = (ray->dir).field_0.m128[2];
        auVar325 = minps((undefined1  [16])aVar404,auVar353);
        aVar354 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar307,auVar340);
        tp1.lower.field_0 = aVar354;
        tp1.upper.field_0 = aVar404;
        auVar341._0_4_ = -(uint)(fVar320 <= auVar325._0_4_) & auVar433._0_4_;
        auVar341._4_4_ = -(uint)(fVar369 <= auVar325._4_4_) & auVar433._4_4_;
        auVar341._8_4_ = -(uint)(fVar383 <= auVar325._8_4_) & auVar433._8_4_;
        auVar341._12_4_ = -(uint)(fVar397 <= auVar325._12_4_) & auVar433._12_4_;
        local_338 = (undefined1  [8])
                    CONCAT44(-(uint)(aVar354.v[1] <= aVar404.v[1]) & auVar433._4_4_,
                             -(uint)(aVar354.v[0] <= aVar404.v[0]) & auVar433._0_4_);
        fStack_330 = (float)(-(uint)(aVar354.v[2] <= aVar404.v[2]) & auVar433._8_4_);
        fStack_32c = (float)(-(uint)(aVar354.v[3] <= aVar404.v[3]) & auVar433._12_4_);
        auVar165._8_4_ = fStack_330;
        auVar165._0_8_ = local_338;
        auVar165._12_4_ = fStack_32c;
        iVar244 = movmskps(iVar244,auVar165 | auVar341);
        lVar129 = CONCAT44((int)((ulong)pSVar121 >> 0x20),iVar244);
        if (iVar244 != 0) {
          local_358 = local_61c;
          fStack_354 = local_61c;
          fStack_350 = local_61c;
          fStack_34c = local_61c;
          auVar211._0_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4e8._0_4_ * fVar391 +
                                                 fVar412 * fVar374 + fVar436 * fVar364)) &
                             auVar390._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar211._4_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4e8._4_4_ * fVar391 +
                                                 fVar416 * fVar374 + fVar439 * fVar364)) &
                             auVar390._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar211._8_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_4e0 * fVar391 + fVar427 * fVar374 +
                                                 fVar444 * fVar364)) & auVar390._8_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar211._12_4_ =
               -(uint)((int)local_61c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_4dc * fVar391 + fVar434 * fVar374 +
                                                 fVar343 * fVar364)) & auVar390._12_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar166 = ~auVar211 & auVar341;
          _local_348 = auVar341;
          while( true ) {
            vVar116.field_0 = tp1.lower.field_0;
            uStack_572 = (undefined2)((uint)fVar338 >> 0x10);
            uStack_574 = SUB42(fVar338,0);
            local_2d8 = auVar166;
            uVar118 = (undefined4)((ulong)lVar129 >> 0x20);
            iVar244 = movmskps((int)lVar129,auVar166);
            lVar129 = CONCAT44(uVar118,iVar244);
            if (iVar244 == 0) break;
            auVar350 = ~auVar166 & _DAT_01f45a30 | auVar166 & auVar307;
            auVar276._4_4_ = auVar350._0_4_;
            auVar276._0_4_ = auVar350._4_4_;
            auVar276._8_4_ = auVar350._12_4_;
            auVar276._12_4_ = auVar350._8_4_;
            auVar325 = minps(auVar276,auVar350);
            auVar212._0_8_ = auVar325._8_8_;
            auVar212._8_4_ = auVar325._0_4_;
            auVar212._12_4_ = auVar325._4_4_;
            auVar325 = minps(auVar212,auVar325);
            auVar213._0_8_ =
                 CONCAT44(-(uint)(auVar325._4_4_ == auVar350._4_4_) & auVar166._4_4_,
                          -(uint)(auVar325._0_4_ == auVar350._0_4_) & auVar166._0_4_);
            auVar213._8_4_ = -(uint)(auVar325._8_4_ == auVar350._8_4_) & auVar166._8_4_;
            auVar213._12_4_ = -(uint)(auVar325._12_4_ == auVar350._12_4_) & auVar166._12_4_;
            iVar244 = movmskps(iVar244,auVar213);
            if (iVar244 != 0) {
              auVar166._8_4_ = auVar213._8_4_;
              auVar166._0_8_ = auVar213._0_8_;
              auVar166._12_4_ = auVar213._12_4_;
            }
            uVar117 = movmskps(iVar244,auVar166);
            uVar130 = CONCAT44(uVar118,uVar117);
            lVar129 = 0;
            if (uVar130 != 0) {
              for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
              }
            }
            *(undefined4 *)(local_2d8 + lVar129 * 4) = 0;
            fVar406 = (ray->dir).field_0.m128[0];
            fVar412 = (ray->dir).field_0.m128[1];
            fVar416 = (ray->dir).field_0.m128[2];
            fVar427 = (ray->dir).field_0.m128[3];
            auVar350 = minps(_local_5f8,_local_4b8);
            auVar389 = maxps(_local_5f8,_local_4b8);
            auVar77._4_4_ = fVar344;
            auVar77._0_4_ = fVar304;
            auVar77._8_4_ = fVar356;
            auVar77._12_4_ = fVar224;
            auVar74._4_2_ = uStack_574;
            auVar74._0_4_ = fVar334;
            auVar74._6_2_ = uStack_572;
            auVar74._8_4_ = fVar342;
            auVar74._12_4_ = fVar303;
            auVar325 = minps(auVar77,auVar74);
            auVar350 = minps(auVar350,auVar325);
            auVar325 = maxps(auVar77,auVar74);
            auVar389 = maxps(auVar389,auVar325);
            auVar277._0_8_ = auVar350._0_8_ & 0x7fffffff7fffffff;
            auVar277._8_4_ = auVar350._8_4_ & 0x7fffffff;
            auVar277._12_4_ = auVar350._12_4_ & 0x7fffffff;
            auVar167._0_8_ = auVar389._0_8_ & 0x7fffffff7fffffff;
            auVar167._8_4_ = auVar389._8_4_ & 0x7fffffff;
            auVar167._12_4_ = ABS(auVar389._12_4_);
            auVar325 = maxps(auVar277,auVar167);
            fVar434 = auVar325._4_4_;
            if (auVar325._4_4_ <= auVar325._0_4_) {
              fVar434 = auVar325._0_4_;
            }
            auVar278._8_8_ = auVar325._8_8_;
            auVar278._0_8_ = auVar325._8_8_;
            if (auVar325._8_4_ <= fVar434) {
              auVar278._0_4_ = fVar434;
            }
            fVar439 = auVar278._0_4_ * 1.9073486e-06;
            fVar434 = *(float *)(local_108 + lVar129 * 4);
            fVar436 = local_118[lVar129 + -8];
            for (uVar130 = 0; uVar130 != 5; uVar130 = uVar130 + 1) {
              fVar324 = SQRT(fVar416 * fVar416 + fVar412 * fVar412 + fVar406 * fVar406) *
                        1.9073486e-06 * fVar436;
              fVar346 = 1.0 - fVar434;
              fVar445 = (float)local_4b8._0_4_ * fVar346 + fVar304 * fVar434;
              fVar321 = (float)local_4b8._4_4_ * fVar346 + fVar344 * fVar434;
              fVar323 = fStack_4b0 * fVar346 + fVar356 * fVar434;
              fVar335 = fStack_4ac * fVar346 + fVar224 * fVar434;
              fVar343 = ((float)local_5f8._0_4_ * fVar346 + (float)local_4b8._0_4_ * fVar434) *
                        fVar346 + fVar434 * fVar445;
              fVar322 = ((float)local_5f8._4_4_ * fVar346 + (float)local_4b8._4_4_ * fVar434) *
                        fVar346 + fVar434 * fVar321;
              fVar345 = (fStack_5f0 * fVar346 + fStack_4b0 * fVar434) * fVar346 + fVar434 * fVar323;
              fVar444 = (fStack_5ec * fVar346 + fStack_4ac * fVar434) * fVar346 + fVar434 * fVar335;
              fVar361 = fVar445 * fVar346 + (fVar304 * fVar346 + fVar334 * fVar434) * fVar434;
              fVar367 = fVar321 * fVar346 + (fVar344 * fVar346 + fVar338 * fVar434) * fVar434;
              fVar370 = fVar323 * fVar346 + (fVar356 * fVar346 + fVar342 * fVar434) * fVar434;
              fVar321 = fVar335 * fVar346 + (fVar224 * fVar346 + fVar303 * fVar434) * fVar434;
              fVar445 = fVar346 * fVar444 + fVar434 * fVar321;
              fVar365 = (fVar361 - fVar343) * 3.0;
              fVar368 = (fVar367 - fVar322) * 3.0;
              fVar375 = (fVar370 - fVar345) * 3.0;
              fVar378 = (fVar321 - fVar444) * 3.0;
              fVar335 = fVar346 * 6.0;
              fVar321 = (fVar434 - (fVar346 + fVar346)) * 6.0;
              fVar323 = (fVar346 - (fVar434 + fVar434)) * 6.0;
              fVar444 = fVar434 * 6.0;
              fVar336 = fVar335 * (float)local_5f8._0_4_ +
                        fVar321 * (float)local_4b8._0_4_ + fVar323 * fVar304 + fVar444 * fVar334;
              fVar337 = fVar335 * (float)local_5f8._4_4_ +
                        fVar321 * (float)local_4b8._4_4_ + fVar323 * fVar344 + fVar444 * fVar338;
              fVar323 = fVar335 * fStack_5f0 +
                        fVar321 * fStack_4b0 + fVar323 * fVar356 + fVar444 * fVar342;
              fVar343 = (fVar436 * fVar406 + 0.0) - (fVar346 * fVar343 + fVar434 * fVar361);
              fVar321 = (fVar436 * fVar412 + 0.0) - (fVar346 * fVar322 + fVar434 * fVar367);
              fVar322 = (fVar436 * fVar416 + 0.0) - (fVar346 * fVar345 + fVar434 * fVar370);
              fVar345 = (fVar436 * fVar427 + 0.0) - fVar445;
              fVar444 = fVar321 * fVar321;
              fStack_3d0 = fVar322 * fVar322;
              fStack_3cc = fVar345 * fVar345;
              local_3d8._0_4_ = fVar444 + fVar343 * fVar343 + fStack_3d0;
              local_3d8._4_4_ = fVar444 + fVar444 + fStack_3cc;
              fStack_3d0 = fVar444 + fStack_3d0 + fStack_3d0;
              fStack_3cc = fVar444 + fStack_3cc + fStack_3cc;
              fVar444 = fVar439;
              if (fVar439 <= fVar324) {
                fVar444 = fVar324;
              }
              fVar346 = fVar368 * fVar368 + fVar365 * fVar365 + fVar375 * fVar375;
              auVar350 = ZEXT416((uint)fVar346);
              auVar325 = rsqrtss(ZEXT416((uint)fVar346),auVar350);
              fVar324 = auVar325._0_4_;
              fVar335 = fVar324 * 1.5 - fVar324 * fVar324 * fVar346 * 0.5 * fVar324;
              fVar380 = fVar365 * fVar335;
              fVar371 = fVar368 * fVar335;
              fVar376 = fVar375 * fVar335;
              fVar379 = fVar378 * fVar335;
              fVar384 = fVar375 * fVar323 + fVar368 * fVar337 + fVar365 * fVar336;
              auVar325 = rcpss(auVar350,auVar350);
              fVar324 = (2.0 - fVar346 * auVar325._0_4_) * auVar325._0_4_;
              fVar361 = fVar321 * fVar371;
              fVar367 = fVar322 * fVar376;
              fVar370 = fVar345 * fVar379;
              fVar381 = fVar361 + fVar343 * fVar380 + fVar367;
              fVar392 = fVar361 + fVar361 + fVar370;
              fVar367 = fVar361 + fVar367 + fVar367;
              fVar370 = fVar361 + fVar370 + fVar370;
              fVar385 = (SQRT((float)local_3d8._0_4_) + 1.0) * (fVar439 / SQRT(fVar346)) +
                        SQRT((float)local_3d8._0_4_) * fVar439 + fVar444;
              fVar361 = fVar379 * -fVar378;
              fVar346 = fVar376 * -fVar375 + fVar371 * -fVar368 + fVar380 * -fVar365 +
                        fVar324 * (fVar346 * fVar323 - fVar384 * fVar375) * fVar335 * fVar322 +
                        fVar324 * (fVar346 * fVar337 - fVar384 * fVar368) * fVar335 * fVar321 +
                        fVar324 * (fVar346 * fVar336 - fVar384 * fVar365) * fVar335 * fVar343;
              fVar336 = fVar416 * fVar376 + fVar412 * fVar371 + fVar406 * fVar380;
              fVar323 = (float)local_3d8._0_4_ - fVar381 * fVar381;
              auVar443._0_8_ = CONCAT44((float)local_3d8._4_4_ - fVar392 * fVar392,fVar323);
              auVar443._8_4_ = fStack_3d0 - fVar367 * fVar367;
              auVar443._12_4_ = fStack_3cc - fVar370 * fVar370;
              fVar335 = -fVar378 * fVar345;
              local_3a8 = CONCAT44(fVar361,fVar346);
              auVar214._8_4_ = auVar443._8_4_;
              auVar214._0_8_ = auVar443._0_8_;
              auVar214._12_4_ = auVar443._12_4_;
              auVar325 = rsqrtss(auVar214,auVar443);
              fVar324 = auVar325._0_4_;
              fVar324 = fVar324 * 1.5 - fVar324 * fVar324 * fVar323 * 0.5 * fVar324;
              if (fVar323 < 0.0) {
                fVar323 = sqrtf(fVar323);
                lVar129 = extraout_RAX;
                pRVar124 = extraout_RDX;
              }
              else {
                fVar323 = SQRT(fVar323);
              }
              fVar323 = fVar323 - fVar445;
              fVar445 = ((-fVar375 * fVar322 + -fVar368 * fVar321 + -fVar365 * fVar343) -
                        fVar381 * fVar346) * fVar324 - fVar378;
              fVar324 = ((fVar416 * fVar322 + fVar412 * fVar321 + fVar406 * fVar343) -
                        fVar381 * fVar336) * fVar324;
              auVar279._0_4_ = fVar346 * fVar324 - fVar336 * fVar445;
              auVar300._8_4_ = -fVar335;
              auVar300._0_8_ = CONCAT44(fVar335,fVar445) ^ 0x8000000000000000;
              auVar300._12_4_ = fVar427 * fVar345;
              auVar299._8_8_ = auVar300._8_8_;
              auVar299._0_8_ = CONCAT44(fVar324,fVar445) ^ 0x80000000;
              auVar279._4_4_ = auVar279._0_4_;
              auVar279._8_4_ = auVar279._0_4_;
              auVar279._12_4_ = auVar279._0_4_;
              auVar325 = divps(auVar299,auVar279);
              auVar318._8_4_ = fVar361;
              auVar318._0_8_ = local_3a8;
              auVar318._12_4_ = -(fVar427 * fVar379);
              auVar317._8_8_ = auVar318._8_8_;
              auVar317._0_8_ = CONCAT44(fVar336,fVar346) ^ 0x8000000000000000;
              auVar350 = divps(auVar317,auVar279);
              fVar436 = fVar436 - (fVar323 * auVar350._0_4_ + fVar381 * auVar325._0_4_);
              fVar434 = fVar434 - (fVar323 * auVar350._4_4_ + fVar381 * auVar325._4_4_);
              if ((ABS(fVar381) < fVar385) &&
                 (ABS(fVar323) < auVar389._12_4_ * 1.9073486e-06 + fVar444 + fVar385)) {
                bVar131 = uVar130 < 5;
                fVar436 = local_318._0_4_ + fVar436;
                lVar129 = 0;
                if ((fVar436 < (ray->org).field_0.m128[3]) ||
                   (fVar406 = ray->tfar, fVar406 < fVar436)) goto LAB_0039a513;
                lVar129 = 0;
                if ((fVar434 < 0.0) || (lVar129 = 0, 1.0 < fVar434)) goto LAB_0039a513;
                auVar325 = rsqrtss(_local_3d8,_local_3d8);
                fVar412 = auVar325._0_4_;
                pGVar25 = (context->scene->geometries).items[(long)pRVar128].ptr;
                pRVar123 = (RTCIntersectArguments *)context;
                pRVar124 = pRVar128;
                if ((pGVar25->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (lVar129 = CONCAT71((int7)((ulong)context->args >> 8),1),
                     pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0039a513;
                  fVar412 = fVar412 * 1.5 +
                            fVar412 * fVar412 * (float)local_3d8._0_4_ * -0.5 * fVar412;
                  fVar343 = fVar343 * fVar412;
                  fVar321 = fVar321 * fVar412;
                  fVar322 = fVar322 * fVar412;
                  fVar412 = fVar378 * fVar343 + fVar365;
                  fVar416 = fVar378 * fVar321 + fVar368;
                  fVar427 = fVar378 * fVar322 + fVar375;
                  fVar439 = fVar321 * fVar365 - fVar368 * fVar343;
                  fVar444 = fVar322 * fVar368 - fVar375 * fVar321;
                  fVar445 = fVar343 * fVar375 - fVar365 * fVar322;
                  vu0.field_0._0_8_ =
                       CONCAT44(fVar412 * fVar439 - fVar444 * fVar427,
                                fVar427 * fVar445 - fVar439 * fVar416);
                  vu0.field_0.v[2] = fVar416 * fVar444 - fVar445 * fVar412;
                  vu0.field_0.v[3] = fVar434;
                  pRVar123 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  ray->tfar = fVar436;
                  local_368._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar25->userPtr;
                  args.valid = (int *)local_368;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  pRVar124 = (RTCIntersectArguments *)context;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0039a720:
                    pRVar123 = context->args;
                    pRVar122 = (RTCIntersectArguments *)pRVar123->filter;
                    if ((pRVar122 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar123->flags & 2) != 0 ||
                        (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                      (*(code *)pRVar122)(&args);
                      pRVar122 = (RTCIntersectArguments *)args.valid;
                      pRVar124 = extraout_RDX_01;
                      if (*args.valid == 0) goto LAB_0039a768;
                    }
                    lVar129 = CONCAT71((int7)((ulong)pRVar122 >> 8),1);
                    goto LAB_0039a513;
                  }
                  (*pGVar25->occlusionFilterN)(&args);
                  pRVar124 = extraout_RDX_00;
                  if (*args.valid != 0) goto LAB_0039a720;
LAB_0039a768:
                  ray->tfar = fVar406;
                }
                lVar129 = 0;
                goto LAB_0039a513;
              }
            }
            bVar131 = false;
LAB_0039a513:
            bVar127 = bVar127 | bVar131 & (byte)lVar129;
            fVar406 = ray->tfar;
            auVar166._0_4_ = -(uint)(fVar286 + fVar320 <= fVar406) & local_2d8._0_4_;
            auVar166._4_4_ = -(uint)(fVar286 + fVar369 <= fVar406) & local_2d8._4_4_;
            auVar166._8_4_ = -(uint)(fVar286 + fVar383 <= fVar406) & local_2d8._8_4_;
            auVar166._12_4_ = -(uint)(fVar286 + fVar397 <= fVar406) & local_2d8._12_4_;
          }
          fVar406 = ray->tfar;
          auVar280._0_4_ = -(uint)(aVar354.v[0] + fVar286 <= fVar406) & local_338._0_4_;
          auVar280._4_4_ = -(uint)(aVar354.v[1] + fVar286 <= fVar406) & local_338._4_4_;
          auVar280._8_4_ = -(uint)(aVar354.v[2] + fVar286 <= fVar406) & (uint)fStack_330;
          auVar280._12_4_ = -(uint)(aVar354.v[3] + fVar286 <= fVar406) & (uint)fStack_32c;
          auVar215._0_4_ =
               -(uint)((int)local_358 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5b8._0_4_ * fVar364 +
                                                 auVar298._0_4_ * fVar374 + fVar366 * fVar391)) &
                             auVar390._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar215._4_4_ =
               -(uint)((int)fStack_354 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5b8._4_4_ * fVar364 +
                                                 auVar298._4_4_ * fVar374 + fVar377 * fVar391)) &
                             auVar390._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar215._8_4_ =
               -(uint)((int)fStack_350 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5b0 * fVar364 +
                                                 auVar298._8_4_ * fVar374 + fVar394 * fVar391)) &
                             auVar390._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar215._12_4_ =
               -(uint)((int)fStack_34c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5ac * fVar364 +
                                                 auVar298._12_4_ * fVar374 + fVar407 * fVar391)) &
                             auVar390._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar216 = ~auVar215 & auVar280;
          fVar364 = fVar286 + tp1.lower.field_0.v[0];
          fVar366 = fVar286 + tp1.lower.field_0.v[1];
          fVar374 = fVar286 + tp1.lower.field_0.v[2];
          fVar377 = fVar286 + tp1.lower.field_0.v[3];
          while( true ) {
            local_368 = auVar216;
            iVar244 = movmskps((int)lVar129,auVar216);
            if (iVar244 == 0) break;
            auVar307 = ~auVar216 & _DAT_01f45a30 | auVar216 & (undefined1  [16])vVar116.field_0;
            auVar281._4_4_ = auVar307._0_4_;
            auVar281._0_4_ = auVar307._4_4_;
            auVar281._8_4_ = auVar307._12_4_;
            auVar281._12_4_ = auVar307._8_4_;
            auVar325 = minps(auVar281,auVar307);
            auVar168._0_8_ = auVar325._8_8_;
            auVar168._8_4_ = auVar325._0_4_;
            auVar168._12_4_ = auVar325._4_4_;
            auVar325 = minps(auVar168,auVar325);
            auVar169._0_8_ =
                 CONCAT44(-(uint)(auVar325._4_4_ == auVar307._4_4_) & auVar216._4_4_,
                          -(uint)(auVar325._0_4_ == auVar307._0_4_) & auVar216._0_4_);
            auVar169._8_4_ = -(uint)(auVar325._8_4_ == auVar307._8_4_) & auVar216._8_4_;
            auVar169._12_4_ = -(uint)(auVar325._12_4_ == auVar307._12_4_) & auVar216._12_4_;
            iVar244 = movmskps(iVar244,auVar169);
            if (iVar244 != 0) {
              auVar216._8_4_ = auVar169._8_4_;
              auVar216._0_8_ = auVar169._0_8_;
              auVar216._12_4_ = auVar169._12_4_;
            }
            uVar118 = movmskps(iVar244,auVar216);
            uVar130 = CONCAT44((int)((ulong)lVar129 >> 0x20),uVar118);
            lVar129 = 0;
            if (uVar130 != 0) {
              for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
              }
            }
            *(undefined4 *)(local_368 + lVar129 * 4) = 0;
            fVar391 = (ray->dir).field_0.m128[0];
            fVar394 = (ray->dir).field_0.m128[1];
            fVar406 = (ray->dir).field_0.m128[2];
            fVar407 = (ray->dir).field_0.m128[3];
            auVar307 = minps(_local_5f8,_local_4b8);
            auVar350 = maxps(_local_5f8,_local_4b8);
            auVar78._4_4_ = fVar344;
            auVar78._0_4_ = fVar304;
            auVar78._8_4_ = fVar356;
            auVar78._12_4_ = fVar224;
            auVar75._4_2_ = uStack_574;
            auVar75._0_4_ = fVar334;
            auVar75._6_2_ = uStack_572;
            auVar75._8_4_ = fVar342;
            auVar75._12_4_ = fVar303;
            auVar325 = minps(auVar78,auVar75);
            auVar307 = minps(auVar307,auVar325);
            auVar325 = maxps(auVar78,auVar75);
            auVar350 = maxps(auVar350,auVar325);
            auVar282._0_8_ = auVar307._0_8_ & 0x7fffffff7fffffff;
            auVar282._8_4_ = auVar307._8_4_ & 0x7fffffff;
            auVar282._12_4_ = auVar307._12_4_ & 0x7fffffff;
            auVar170._0_8_ = auVar350._0_8_ & 0x7fffffff7fffffff;
            auVar170._8_4_ = auVar350._8_4_ & 0x7fffffff;
            auVar170._12_4_ = ABS(auVar350._12_4_);
            auVar325 = maxps(auVar282,auVar170);
            fVar412 = auVar325._4_4_;
            if (auVar325._4_4_ <= auVar325._0_4_) {
              fVar412 = auVar325._0_4_;
            }
            auVar283._8_8_ = auVar325._8_8_;
            auVar283._0_8_ = auVar325._8_8_;
            if (auVar325._8_4_ <= fVar412) {
              auVar283._0_4_ = fVar412;
            }
            fVar427 = auVar283._0_4_ * 1.9073486e-06;
            fVar412 = local_118[lVar129];
            fVar416 = tp1.upper.field_0.v[lVar129];
            for (uVar130 = 0; uVar130 != 5; uVar130 = uVar130 + 1) {
              fVar445 = SQRT(fVar406 * fVar406 + fVar394 * fVar394 + fVar391 * fVar391) *
                        1.9073486e-06 * fVar416;
              fVar434 = 1.0 - fVar412;
              fVar439 = (float)local_4b8._0_4_ * fVar434 + fVar304 * fVar412;
              fVar444 = (float)local_4b8._4_4_ * fVar434 + fVar344 * fVar412;
              fVar343 = fStack_4b0 * fVar434 + fVar356 * fVar412;
              fVar322 = fStack_4ac * fVar434 + fVar224 * fVar412;
              fVar321 = ((float)local_5f8._0_4_ * fVar434 + (float)local_4b8._0_4_ * fVar412) *
                        fVar434 + fVar412 * fVar439;
              fVar345 = ((float)local_5f8._4_4_ * fVar434 + (float)local_4b8._4_4_ * fVar412) *
                        fVar434 + fVar412 * fVar444;
              fVar323 = (fStack_5f0 * fVar434 + fStack_4b0 * fVar412) * fVar434 + fVar412 * fVar343;
              fVar436 = (fStack_5ec * fVar434 + fStack_4ac * fVar412) * fVar434 + fVar412 * fVar322;
              fVar335 = fVar439 * fVar434 + (fVar304 * fVar434 + fVar334 * fVar412) * fVar412;
              fVar337 = fVar444 * fVar434 + (fVar344 * fVar434 + fVar338 * fVar412) * fVar412;
              fVar365 = fVar343 * fVar434 + (fVar356 * fVar434 + fVar342 * fVar412) * fVar412;
              fVar439 = fVar322 * fVar434 + (fVar224 * fVar434 + fVar303 * fVar412) * fVar412;
              fVar346 = fVar434 * fVar436 + fVar412 * fVar439;
              fVar336 = (fVar335 - fVar321) * 3.0;
              fVar361 = (fVar337 - fVar345) * 3.0;
              fVar367 = (fVar365 - fVar323) * 3.0;
              fVar368 = (fVar439 - fVar436) * 3.0;
              fVar436 = fVar434 * 6.0;
              fVar322 = (fVar412 - (fVar434 + fVar434)) * 6.0;
              fVar324 = (fVar434 - (fVar412 + fVar412)) * 6.0;
              fVar343 = fVar412 * 6.0;
              fVar439 = fVar436 * (float)local_5f8._0_4_ +
                        fVar322 * (float)local_4b8._0_4_ + fVar324 * fVar304 + fVar343 * fVar334;
              fVar444 = fVar436 * (float)local_5f8._4_4_ +
                        fVar322 * (float)local_4b8._4_4_ + fVar324 * fVar344 + fVar343 * fVar338;
              fVar436 = fVar436 * fStack_5f0 +
                        fVar322 * fStack_4b0 + fVar324 * fVar356 + fVar343 * fVar342;
              fVar343 = (fVar416 * fVar391 + 0.0) - (fVar434 * fVar321 + fVar412 * fVar335);
              fVar321 = (fVar416 * fVar394 + 0.0) - (fVar434 * fVar345 + fVar412 * fVar337);
              fVar322 = (fVar416 * fVar406 + 0.0) - (fVar434 * fVar323 + fVar412 * fVar365);
              fVar345 = (fVar416 * fVar407 + 0.0) - fVar346;
              fVar434 = fVar321 * fVar321;
              fStack_3d0 = fVar322 * fVar322;
              fStack_3cc = fVar345 * fVar345;
              local_3d8._0_4_ = fVar434 + fVar343 * fVar343 + fStack_3d0;
              local_3d8._4_4_ = fVar434 + fVar434 + fStack_3cc;
              fStack_3d0 = fVar434 + fStack_3d0 + fStack_3d0;
              fStack_3cc = fVar434 + fStack_3cc + fStack_3cc;
              fVar434 = fVar427;
              if (fVar427 <= fVar445) {
                fVar434 = fVar445;
              }
              fVar323 = fVar361 * fVar361 + fVar336 * fVar336 + fVar367 * fVar367;
              auVar325 = ZEXT416((uint)fVar323);
              auVar307 = rsqrtss(ZEXT416((uint)fVar323),auVar325);
              fVar445 = auVar307._0_4_;
              fVar324 = fVar445 * 1.5 - fVar445 * fVar445 * fVar323 * 0.5 * fVar445;
              fVar375 = fVar336 * fVar324;
              fVar378 = fVar361 * fVar324;
              fVar380 = fVar367 * fVar324;
              fVar371 = fVar368 * fVar324;
              fVar370 = fVar367 * fVar436 + fVar361 * fVar444 + fVar336 * fVar439;
              auVar325 = rcpss(auVar325,auVar325);
              fVar445 = (2.0 - fVar323 * auVar325._0_4_) * auVar325._0_4_;
              fVar335 = fVar321 * fVar378;
              fVar337 = fVar322 * fVar380;
              fVar365 = fVar345 * fVar371;
              fVar379 = fVar335 + fVar343 * fVar375 + fVar337;
              fVar384 = fVar335 + fVar335 + fVar365;
              fVar337 = fVar335 + fVar337 + fVar337;
              fVar365 = fVar335 + fVar365 + fVar365;
              fVar335 = (SQRT((float)local_3d8._0_4_) + 1.0) * (fVar427 / SQRT(fVar323)) +
                        SQRT((float)local_3d8._0_4_) * fVar427 + fVar434;
              fVar376 = fVar371 * -fVar368;
              fVar444 = fVar380 * -fVar367 + fVar378 * -fVar361 + fVar375 * -fVar336 +
                        fVar445 * (fVar323 * fVar436 - fVar370 * fVar367) * fVar324 * fVar322 +
                        fVar445 * (fVar323 * fVar444 - fVar370 * fVar361) * fVar324 * fVar321 +
                        fVar445 * (fVar323 * fVar439 - fVar370 * fVar336) * fVar324 * fVar343;
              fVar323 = fVar406 * fVar380 + fVar394 * fVar378 + fVar391 * fVar375;
              fVar436 = (float)local_3d8._0_4_ - fVar379 * fVar379;
              auVar423._0_8_ = CONCAT44((float)local_3d8._4_4_ - fVar384 * fVar384,fVar436);
              auVar423._8_4_ = fStack_3d0 - fVar337 * fVar337;
              auVar423._12_4_ = fStack_3cc - fVar365 * fVar365;
              fVar445 = -fVar368 * fVar345;
              auVar217._8_4_ = auVar423._8_4_;
              auVar217._0_8_ = auVar423._0_8_;
              auVar217._12_4_ = auVar423._12_4_;
              auVar325 = rsqrtss(auVar217,auVar423);
              fVar439 = auVar325._0_4_;
              fVar439 = fVar439 * 1.5 - fVar439 * fVar439 * fVar436 * 0.5 * fVar439;
              if (fVar436 < 0.0) {
                fVar436 = sqrtf(fVar436);
                lVar129 = extraout_RAX_00;
                pRVar124 = extraout_RDX_02;
              }
              else {
                fVar436 = SQRT(fVar436);
              }
              fVar436 = fVar436 - fVar346;
              fVar324 = ((-fVar367 * fVar322 + -fVar361 * fVar321 + -fVar336 * fVar343) -
                        fVar379 * fVar444) * fVar439 - fVar368;
              fVar439 = ((fVar406 * fVar322 + fVar394 * fVar321 + fVar391 * fVar343) -
                        fVar379 * fVar323) * fVar439;
              auVar332._4_4_ = fVar376;
              auVar332._0_4_ = fVar444;
              auVar284._0_4_ = fVar444 * fVar439 - fVar323 * fVar324;
              auVar302._8_4_ = -fVar445;
              auVar302._0_8_ = CONCAT44(fVar445,fVar324) ^ 0x8000000000000000;
              auVar302._12_4_ = fVar407 * fVar345;
              auVar301._8_8_ = auVar302._8_8_;
              auVar301._0_8_ = CONCAT44(fVar439,fVar324) ^ 0x80000000;
              auVar284._4_4_ = auVar284._0_4_;
              auVar284._8_4_ = auVar284._0_4_;
              auVar284._12_4_ = auVar284._0_4_;
              auVar325 = divps(auVar301,auVar284);
              auVar332._8_4_ = fVar376;
              auVar332._12_4_ = -(fVar407 * fVar371);
              auVar331._8_8_ = auVar332._8_8_;
              auVar331._0_8_ = CONCAT44(fVar323,fVar444) ^ 0x8000000000000000;
              auVar307 = divps(auVar331,auVar284);
              fVar416 = fVar416 - (fVar436 * auVar307._0_4_ + fVar379 * auVar325._0_4_);
              fVar412 = fVar412 - (fVar436 * auVar307._4_4_ + fVar379 * auVar325._4_4_);
              if ((ABS(fVar379) < fVar335) &&
                 (ABS(fVar436) < auVar350._12_4_ * 1.9073486e-06 + fVar434 + fVar335)) {
                bVar131 = uVar130 < 5;
                fVar416 = local_318._0_4_ + fVar416;
                lVar129 = 0;
                if ((fVar416 < (ray->org).field_0.m128[3]) ||
                   (fVar391 = ray->tfar, fVar391 < fVar416)) goto LAB_0039ae6d;
                lVar129 = 0;
                if ((fVar412 < 0.0) || (lVar129 = 0, 1.0 < fVar412)) goto LAB_0039ae6d;
                auVar325 = rsqrtss(_local_3d8,_local_3d8);
                fVar394 = auVar325._0_4_;
                pGVar25 = (context->scene->geometries).items[(long)pRVar128].ptr;
                pRVar123 = (RTCIntersectArguments *)context;
                pRVar124 = pRVar128;
                if ((pGVar25->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (lVar129 = CONCAT71((int7)((ulong)context->args >> 8),1),
                     pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0039ae6d;
                  fVar394 = fVar394 * 1.5 +
                            fVar394 * fVar394 * (float)local_3d8._0_4_ * -0.5 * fVar394;
                  fVar343 = fVar343 * fVar394;
                  fVar321 = fVar321 * fVar394;
                  fVar322 = fVar322 * fVar394;
                  fVar394 = fVar368 * fVar343 + fVar336;
                  fVar406 = fVar368 * fVar321 + fVar361;
                  fVar407 = fVar368 * fVar322 + fVar367;
                  fVar427 = fVar321 * fVar336 - fVar361 * fVar343;
                  fVar434 = fVar322 * fVar361 - fVar367 * fVar321;
                  fVar436 = fVar343 * fVar367 - fVar336 * fVar322;
                  vu0.field_0._0_8_ =
                       CONCAT44(fVar394 * fVar427 - fVar434 * fVar407,
                                fVar407 * fVar436 - fVar427 * fVar406);
                  vu0.field_0.v[2] = fVar406 * fVar434 - fVar436 * fVar394;
                  vu0.field_0.v[3] = fVar412;
                  pRVar123 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  ray->tfar = fVar416;
                  local_51c = -1;
                  args.geometryUserPtr = pGVar25->userPtr;
                  args.valid = &local_51c;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  pRVar124 = (RTCIntersectArguments *)context;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0039b092:
                    pRVar123 = context->args;
                    pRVar122 = (RTCIntersectArguments *)pRVar123->filter;
                    if ((pRVar122 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar123->flags & 2) != 0 ||
                        (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                      (*(code *)pRVar122)(&args);
                      pRVar122 = (RTCIntersectArguments *)args.valid;
                      pRVar124 = extraout_RDX_04;
                      if (*args.valid == 0) goto LAB_0039b0ec;
                    }
                    lVar129 = CONCAT71((int7)((ulong)pRVar122 >> 8),1);
                    goto LAB_0039ae6d;
                  }
                  (*pGVar25->occlusionFilterN)(&args);
                  pRVar124 = extraout_RDX_03;
                  if (*args.valid != 0) goto LAB_0039b092;
LAB_0039b0ec:
                  ray->tfar = fVar391;
                }
                lVar129 = 0;
                goto LAB_0039ae6d;
              }
            }
            bVar131 = false;
LAB_0039ae6d:
            bVar127 = bVar127 | bVar131 & (byte)lVar129;
            fVar406 = ray->tfar;
            auVar216._0_4_ = -(uint)(fVar364 <= fVar406) & local_368._0_4_;
            auVar216._4_4_ = -(uint)(fVar366 <= fVar406) & local_368._4_4_;
            auVar216._8_4_ = -(uint)(fVar374 <= fVar406) & local_368._8_4_;
            auVar216._12_4_ = -(uint)(fVar377 <= fVar406) & local_368._12_4_;
          }
          auVar319._0_4_ = auVar211._0_4_ & local_348._0_4_ & -(uint)(fVar286 + fVar320 <= fVar406);
          auVar319._4_4_ = auVar211._4_4_ & local_348._4_4_ & -(uint)(fVar286 + fVar369 <= fVar406);
          auVar319._8_4_ = auVar211._8_4_ & (uint)fStack_340 & -(uint)(fVar286 + fVar383 <= fVar406)
          ;
          auVar319._12_4_ =
               auVar211._12_4_ & (uint)fStack_33c & -(uint)(fVar286 + fVar397 <= fVar406);
          auVar171._0_4_ =
               auVar215._0_4_ & auVar280._0_4_ &
               -(uint)(fVar286 + tp1.lower.field_0.v[0] <= fVar406);
          auVar171._4_4_ =
               auVar215._4_4_ & auVar280._4_4_ &
               -(uint)(fVar286 + tp1.lower.field_0.v[1] <= fVar406);
          auVar171._8_4_ =
               auVar215._8_4_ & auVar280._8_4_ &
               -(uint)(fVar286 + tp1.lower.field_0.v[2] <= fVar406);
          auVar171._12_4_ =
               auVar215._12_4_ & auVar280._12_4_ &
               -(uint)(fVar286 + tp1.lower.field_0.v[3] <= fVar406);
          iVar244 = movmskps(0,auVar171 | auVar319);
          if (iVar244 != 0) {
            stack[(long)pRVar125].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar171 | auVar319);
            stack[(long)pRVar125].tlower.field_0.i[0] =
                 ~auVar319._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar320 & auVar319._0_4_;
            stack[(long)pRVar125].tlower.field_0.i[1] =
                 ~auVar319._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar369 & auVar319._4_4_;
            stack[(long)pRVar125].tlower.field_0.i[2] =
                 ~auVar319._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar383 & auVar319._8_4_;
            stack[(long)pRVar125].tlower.field_0.i[3] =
                 ~auVar319._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar397 & auVar319._12_4_;
            stack[(long)pRVar125].u0 = fVar411;
            stack[(long)pRVar125].u1 = fVar183;
            pRVar123 = (RTCIntersectArguments *)(ulong)((int)local_61c + 1U);
            stack[(long)pRVar125].depth = (int)local_61c + 1U;
            pRVar125 = (RTCIntersectArguments *)(ulong)((int)pRVar125 + 1);
          }
        }
      }
    }
    fVar411 = ray->tfar;
    pRVar122 = pRVar123;
    do {
      pRVar126 = pRVar125;
      iVar244 = (int)pRVar126;
      if (iVar244 == 0) {
        if (bVar127 != 0) goto LAB_0039b368;
        auVar219._4_4_ = -(uint)(fVar179 <= fVar411);
        auVar219._0_4_ = -(uint)(fVar138 <= fVar411);
        auVar219._8_4_ = -(uint)(fVar181 <= fVar411);
        auVar219._12_4_ = -(uint)(fVar182 <= fVar411);
        uVar133 = movmskps((int)pRVar122,auVar219);
        uVar132 = uVar132 - 1 & uVar132 & uVar133;
        goto LAB_00398d5d;
      }
      pRVar122 = (RTCIntersectArguments *)(ulong)(iVar244 - 1U);
      fVar183 = stack[(long)pRVar122].tlower.field_0.v[0];
      fVar320 = stack[(long)pRVar122].tlower.field_0.v[1];
      fVar364 = stack[(long)pRVar122].tlower.field_0.v[2];
      fVar366 = stack[(long)pRVar122].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(fVar286 + fVar183 <= fVar411) & stack[(long)pRVar122].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fVar286 + fVar320 <= fVar411) & stack[(long)pRVar122].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fVar286 + fVar364 <= fVar411) & stack[(long)pRVar122].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fVar286 + fVar366 <= fVar411) & stack[(long)pRVar122].valid.field_0.i[3];
      uVar133 = movmskps((int)pRVar124,(undefined1  [16])args._0_16_);
      pRVar124 = (RTCIntersectArguments *)(ulong)uVar133;
      pRVar125 = pRVar122;
    } while (uVar133 == 0);
    auVar242._0_4_ = (uint)fVar183 & (uint)args.valid;
    auVar242._4_4_ = (uint)fVar320 & args.valid._4_4_;
    auVar242._8_4_ = (uint)fVar364 & (uint)args.geometryUserPtr;
    auVar242._12_4_ = (uint)fVar366 & args.geometryUserPtr._4_4_;
    auVar285._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar285._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar285._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar285 = auVar285 | auVar242;
    auVar243._4_4_ = auVar285._0_4_;
    auVar243._0_4_ = auVar285._4_4_;
    auVar243._8_4_ = auVar285._12_4_;
    auVar243._12_4_ = auVar285._8_4_;
    auVar325 = minps(auVar243,auVar285);
    auVar172._0_8_ = auVar325._8_8_;
    auVar172._8_4_ = auVar325._0_4_;
    auVar172._12_4_ = auVar325._4_4_;
    auVar325 = minps(auVar172,auVar325);
    auVar173._0_8_ =
         CONCAT44(-(uint)(auVar325._4_4_ == auVar285._4_4_) & args.valid._4_4_,
                  -(uint)(auVar325._0_4_ == auVar285._0_4_) & (uint)args.valid);
    auVar173._8_4_ = -(uint)(auVar325._8_4_ == auVar285._8_4_) & (uint)args.geometryUserPtr;
    auVar173._12_4_ = -(uint)(auVar325._12_4_ == auVar285._12_4_) & args.geometryUserPtr._4_4_;
    iVar178 = movmskps(iVar244 - 1U,auVar173);
    auVar218 = (undefined1  [16])args._0_16_;
    if (iVar178 != 0) {
      auVar218._8_4_ = auVar173._8_4_;
      auVar218._0_8_ = auVar173._0_8_;
      auVar218._12_4_ = auVar173._12_4_;
    }
    pSVar121 = stack + (long)pRVar122;
    uVar133 = movmskps(iVar178,auVar218);
    pRVar123 = (RTCIntersectArguments *)0x0;
    if (uVar133 != 0) {
      for (; (uVar133 >> (long)pRVar123 & 1) == 0;
          pRVar123 = (RTCIntersectArguments *)((long)&pRVar123->flags + 1)) {
      }
    }
    *(undefined4 *)(local_4e8 + (long)pRVar123 * 4 + -0x30) = 0;
    uVar8 = stack[(long)pRVar122].u0;
    uVar17 = stack[(long)pRVar122].u1;
    local_61c = (float)stack[(long)pRVar122].depth;
    iVar178 = movmskps(local_61c,(undefined1  [16])args._0_16_);
    pRVar124 = (RTCIntersectArguments *)(ulong)(iVar244 - 1);
    if (iVar178 != 0) {
      pRVar124 = pRVar126;
    }
    (pSVar121->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar411 = (float)uVar17 - (float)uVar8;
    vu0.field_0.v[1] = fVar411 * 0.33333334 + (float)uVar8;
    vu0.field_0.v[0] = fVar411 * 0.0 + (float)uVar8;
    vu0.field_0.v[2] = fVar411 * 0.6666667 + (float)uVar8;
    vu0.field_0.v[3] = fVar411 * 1.0 + (float)uVar8;
    fVar411 = vu0.field_0.v[(long)pRVar123];
    fVar183 = *(float *)((long)&vu0.field_0 + (long)pRVar123 * 4 + 4);
    pRVar125 = pRVar124;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }